

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  undefined8 *puVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  __int_type_conflict _Var13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined8 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar62;
  uint uVar63;
  ulong uVar64;
  byte bVar65;
  uint uVar66;
  ulong uVar67;
  long lVar68;
  long lVar69;
  uint uVar70;
  uint uVar71;
  bool bVar72;
  vint4 bi_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar91 [16];
  undefined1 auVar107 [32];
  undefined1 auVar92 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  vint4 bi;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar126 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar184;
  float fVar185;
  vint4 bi_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar186;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar150;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar187;
  float fVar207;
  float fVar208;
  vint4 ai_1;
  undefined1 auVar188 [16];
  float fVar209;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  float fVar210;
  float fVar234;
  float fVar235;
  vint4 ai_2;
  undefined1 auVar211 [16];
  float fVar236;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar237;
  float fVar251;
  float fVar252;
  undefined1 auVar238 [16];
  float fVar253;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  vint4 ai;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  vfloat4 a0_1;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar304;
  float fVar311;
  float fVar312;
  undefined1 auVar305 [16];
  float fVar313;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [32];
  float fVar314;
  float fVar322;
  float fVar323;
  undefined1 auVar315 [16];
  float fVar324;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [32];
  float fVar325;
  float fVar330;
  float fVar331;
  undefined1 auVar326 [16];
  float fVar332;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar343;
  float fVar344;
  undefined1 auVar338 [16];
  float fVar345;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  float fVar346;
  float fVar347;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar359;
  float fVar360;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  vfloat4 a0;
  float fVar367;
  undefined1 auVar361 [16];
  float fVar368;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  uint local_528;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  uint auStack_490 [4];
  RTCFilterFunctionNArguments local_480;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar265 [32];
  undefined1 auVar355 [32];
  
  PVar7 = prim[1];
  uVar64 = (ulong)(byte)PVar7;
  lVar68 = uVar64 * 0x25;
  fVar149 = *(float *)(prim + lVar68 + 0x12);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar194 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar194 = vinsertps_avx(auVar194,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar84 = vsubps_avx(auVar84,*(undefined1 (*) [16])(prim + lVar68 + 6));
  auVar114._0_4_ = fVar149 * auVar84._0_4_;
  auVar114._4_4_ = fVar149 * auVar84._4_4_;
  auVar114._8_4_ = fVar149 * auVar84._8_4_;
  auVar114._12_4_ = fVar149 * auVar84._12_4_;
  auVar266._0_4_ = fVar149 * auVar194._0_4_;
  auVar266._4_4_ = fVar149 * auVar194._4_4_;
  auVar266._8_4_ = fVar149 * auVar194._8_4_;
  auVar266._12_4_ = fVar149 * auVar194._12_4_;
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar281 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar281 = vcvtdq2ps_avx(auVar281);
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar64 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar129 = vshufps_avx(auVar266,auVar266,0);
  auVar83 = vshufps_avx(auVar266,auVar266,0x55);
  auVar272 = vshufps_avx(auVar266,auVar266,0xaa);
  fVar149 = auVar272._0_4_;
  fVar184 = auVar272._4_4_;
  fVar185 = auVar272._8_4_;
  fVar186 = auVar272._12_4_;
  fVar210 = auVar83._0_4_;
  fVar234 = auVar83._4_4_;
  fVar235 = auVar83._8_4_;
  fVar236 = auVar83._12_4_;
  fVar187 = auVar129._0_4_;
  fVar207 = auVar129._4_4_;
  fVar208 = auVar129._8_4_;
  fVar209 = auVar129._12_4_;
  auVar326._0_4_ = fVar187 * auVar84._0_4_ + fVar210 * auVar194._0_4_ + fVar149 * auVar179._0_4_;
  auVar326._4_4_ = fVar207 * auVar84._4_4_ + fVar234 * auVar194._4_4_ + fVar184 * auVar179._4_4_;
  auVar326._8_4_ = fVar208 * auVar84._8_4_ + fVar235 * auVar194._8_4_ + fVar185 * auVar179._8_4_;
  auVar326._12_4_ = fVar209 * auVar84._12_4_ + fVar236 * auVar194._12_4_ + fVar186 * auVar179._12_4_
  ;
  auVar338._0_4_ = fVar187 * auVar281._0_4_ + fVar210 * auVar15._0_4_ + auVar163._0_4_ * fVar149;
  auVar338._4_4_ = fVar207 * auVar281._4_4_ + fVar234 * auVar15._4_4_ + auVar163._4_4_ * fVar184;
  auVar338._8_4_ = fVar208 * auVar281._8_4_ + fVar235 * auVar15._8_4_ + auVar163._8_4_ * fVar185;
  auVar338._12_4_ = fVar209 * auVar281._12_4_ + fVar236 * auVar15._12_4_ + auVar163._12_4_ * fVar186
  ;
  auVar267._0_4_ = fVar187 * auVar139._0_4_ + fVar210 * auVar128._0_4_ + auVar169._0_4_ * fVar149;
  auVar267._4_4_ = fVar207 * auVar139._4_4_ + fVar234 * auVar128._4_4_ + auVar169._4_4_ * fVar184;
  auVar267._8_4_ = fVar208 * auVar139._8_4_ + fVar235 * auVar128._8_4_ + auVar169._8_4_ * fVar185;
  auVar267._12_4_ =
       fVar209 * auVar139._12_4_ + fVar236 * auVar128._12_4_ + auVar169._12_4_ * fVar186;
  auVar129 = vshufps_avx(auVar114,auVar114,0);
  auVar83 = vshufps_avx(auVar114,auVar114,0x55);
  auVar272 = vshufps_avx(auVar114,auVar114,0xaa);
  fVar149 = auVar272._0_4_;
  fVar184 = auVar272._4_4_;
  fVar185 = auVar272._8_4_;
  fVar186 = auVar272._12_4_;
  fVar210 = auVar83._0_4_;
  fVar234 = auVar83._4_4_;
  fVar235 = auVar83._8_4_;
  fVar236 = auVar83._12_4_;
  fVar187 = auVar129._0_4_;
  fVar207 = auVar129._4_4_;
  fVar208 = auVar129._8_4_;
  fVar209 = auVar129._12_4_;
  auVar115._0_4_ = fVar187 * auVar84._0_4_ + fVar210 * auVar194._0_4_ + fVar149 * auVar179._0_4_;
  auVar115._4_4_ = fVar207 * auVar84._4_4_ + fVar234 * auVar194._4_4_ + fVar184 * auVar179._4_4_;
  auVar115._8_4_ = fVar208 * auVar84._8_4_ + fVar235 * auVar194._8_4_ + fVar185 * auVar179._8_4_;
  auVar115._12_4_ = fVar209 * auVar84._12_4_ + fVar236 * auVar194._12_4_ + fVar186 * auVar179._12_4_
  ;
  auVar73._0_4_ = fVar187 * auVar281._0_4_ + auVar163._0_4_ * fVar149 + fVar210 * auVar15._0_4_;
  auVar73._4_4_ = fVar207 * auVar281._4_4_ + auVar163._4_4_ * fVar184 + fVar234 * auVar15._4_4_;
  auVar73._8_4_ = fVar208 * auVar281._8_4_ + auVar163._8_4_ * fVar185 + fVar235 * auVar15._8_4_;
  auVar73._12_4_ = fVar209 * auVar281._12_4_ + auVar163._12_4_ * fVar186 + fVar236 * auVar15._12_4_;
  auVar276._8_4_ = 0x7fffffff;
  auVar276._0_8_ = 0x7fffffff7fffffff;
  auVar276._12_4_ = 0x7fffffff;
  auVar84 = vandps_avx(auVar326,auVar276);
  auVar211._8_4_ = 0x219392ef;
  auVar211._0_8_ = 0x219392ef219392ef;
  auVar211._12_4_ = 0x219392ef;
  auVar84 = vcmpps_avx(auVar84,auVar211,1);
  auVar194 = vblendvps_avx(auVar326,auVar211,auVar84);
  auVar84 = vandps_avx(auVar338,auVar276);
  auVar84 = vcmpps_avx(auVar84,auVar211,1);
  auVar179 = vblendvps_avx(auVar338,auVar211,auVar84);
  auVar84 = vandps_avx(auVar276,auVar267);
  auVar84 = vcmpps_avx(auVar84,auVar211,1);
  auVar84 = vblendvps_avx(auVar267,auVar211,auVar84);
  auVar151._0_4_ = fVar187 * auVar139._0_4_ + fVar210 * auVar128._0_4_ + auVar169._0_4_ * fVar149;
  auVar151._4_4_ = fVar207 * auVar139._4_4_ + fVar234 * auVar128._4_4_ + auVar169._4_4_ * fVar184;
  auVar151._8_4_ = fVar208 * auVar139._8_4_ + fVar235 * auVar128._8_4_ + auVar169._8_4_ * fVar185;
  auVar151._12_4_ =
       fVar209 * auVar139._12_4_ + fVar236 * auVar128._12_4_ + auVar169._12_4_ * fVar186;
  auVar281 = vrcpps_avx(auVar194);
  fVar187 = auVar281._0_4_;
  auVar188._0_4_ = fVar187 * auVar194._0_4_;
  fVar207 = auVar281._4_4_;
  auVar188._4_4_ = fVar207 * auVar194._4_4_;
  fVar208 = auVar281._8_4_;
  auVar188._8_4_ = fVar208 * auVar194._8_4_;
  fVar209 = auVar281._12_4_;
  auVar188._12_4_ = fVar209 * auVar194._12_4_;
  auVar277._8_4_ = 0x3f800000;
  auVar277._0_8_ = 0x3f8000003f800000;
  auVar277._12_4_ = 0x3f800000;
  auVar194 = vsubps_avx(auVar277,auVar188);
  fVar187 = fVar187 + fVar187 * auVar194._0_4_;
  fVar207 = fVar207 + fVar207 * auVar194._4_4_;
  fVar208 = fVar208 + fVar208 * auVar194._8_4_;
  fVar209 = fVar209 + fVar209 * auVar194._12_4_;
  auVar194 = vrcpps_avx(auVar179);
  fVar210 = auVar194._0_4_;
  auVar238._0_4_ = fVar210 * auVar179._0_4_;
  fVar234 = auVar194._4_4_;
  auVar238._4_4_ = fVar234 * auVar179._4_4_;
  fVar235 = auVar194._8_4_;
  auVar238._8_4_ = fVar235 * auVar179._8_4_;
  fVar236 = auVar194._12_4_;
  auVar238._12_4_ = fVar236 * auVar179._12_4_;
  auVar194 = vsubps_avx(auVar277,auVar238);
  fVar210 = fVar210 + fVar210 * auVar194._0_4_;
  fVar234 = fVar234 + fVar234 * auVar194._4_4_;
  fVar235 = fVar235 + fVar235 * auVar194._8_4_;
  fVar236 = fVar236 + fVar236 * auVar194._12_4_;
  auVar194 = vrcpps_avx(auVar84);
  fVar237 = auVar194._0_4_;
  auVar254._0_4_ = fVar237 * auVar84._0_4_;
  fVar251 = auVar194._4_4_;
  auVar254._4_4_ = fVar251 * auVar84._4_4_;
  fVar252 = auVar194._8_4_;
  auVar254._8_4_ = fVar252 * auVar84._8_4_;
  fVar253 = auVar194._12_4_;
  auVar254._12_4_ = fVar253 * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar277,auVar254);
  fVar237 = fVar237 + fVar237 * auVar84._0_4_;
  fVar251 = fVar251 + fVar251 * auVar84._4_4_;
  fVar252 = fVar252 + fVar252 * auVar84._8_4_;
  fVar253 = fVar253 + fVar253 * auVar84._12_4_;
  auVar84 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar68 + 0x16)) *
                          *(float *)(prim + lVar68 + 0x1a)));
  auVar179 = vshufps_avx(auVar84,auVar84,0);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar84 = vpmovsxwd_avx(auVar84);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar194 = vpmovsxwd_avx(auVar194);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar281 = vsubps_avx(auVar194,auVar84);
  fVar149 = auVar179._0_4_;
  fVar184 = auVar179._4_4_;
  fVar185 = auVar179._8_4_;
  fVar186 = auVar179._12_4_;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar194 = vpmovsxwd_avx(auVar179);
  auVar268._0_4_ = auVar281._0_4_ * fVar149 + auVar84._0_4_;
  auVar268._4_4_ = auVar281._4_4_ * fVar184 + auVar84._4_4_;
  auVar268._8_4_ = auVar281._8_4_ * fVar185 + auVar84._8_4_;
  auVar268._12_4_ = auVar281._12_4_ * fVar186 + auVar84._12_4_;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar179 = vpmovsxwd_avx(auVar281);
  auVar84 = vcvtdq2ps_avx(auVar194);
  auVar194 = vcvtdq2ps_avx(auVar179);
  auVar194 = vsubps_avx(auVar194,auVar84);
  auVar278._0_4_ = auVar194._0_4_ * fVar149 + auVar84._0_4_;
  auVar278._4_4_ = auVar194._4_4_ * fVar184 + auVar84._4_4_;
  auVar278._8_4_ = auVar194._8_4_ * fVar185 + auVar84._8_4_;
  auVar278._12_4_ = auVar194._12_4_ * fVar186 + auVar84._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar84 = vpmovsxwd_avx(auVar15);
  uVar67 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *(ulong *)(prim + uVar64 * 2 + uVar67 + 6);
  auVar194 = vpmovsxwd_avx(auVar163);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar194 = vsubps_avx(auVar194,auVar84);
  auVar291._0_4_ = auVar194._0_4_ * fVar149 + auVar84._0_4_;
  auVar291._4_4_ = auVar194._4_4_ * fVar184 + auVar84._4_4_;
  auVar291._8_4_ = auVar194._8_4_ * fVar185 + auVar84._8_4_;
  auVar291._12_4_ = auVar194._12_4_ * fVar186 + auVar84._12_4_;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar84 = vpmovsxwd_avx(auVar139);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar194 = vpmovsxwd_avx(auVar128);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar179 = vsubps_avx(auVar194,auVar84);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar194 = vpmovsxwd_avx(auVar169);
  auVar305._0_4_ = auVar179._0_4_ * fVar149 + auVar84._0_4_;
  auVar305._4_4_ = auVar179._4_4_ * fVar184 + auVar84._4_4_;
  auVar305._8_4_ = auVar179._8_4_ * fVar185 + auVar84._8_4_;
  auVar305._12_4_ = auVar179._12_4_ * fVar186 + auVar84._12_4_;
  auVar84 = vcvtdq2ps_avx(auVar194);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar194 = vpmovsxwd_avx(auVar129);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar194 = vsubps_avx(auVar194,auVar84);
  auVar315._0_4_ = auVar194._0_4_ * fVar149 + auVar84._0_4_;
  auVar315._4_4_ = auVar194._4_4_ * fVar184 + auVar84._4_4_;
  auVar315._8_4_ = auVar194._8_4_ * fVar185 + auVar84._8_4_;
  auVar315._12_4_ = auVar194._12_4_ * fVar186 + auVar84._12_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar64) + 6);
  auVar84 = vpmovsxwd_avx(auVar83);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar272._8_8_ = 0;
  auVar272._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar194 = vpmovsxwd_avx(auVar272);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar194 = vsubps_avx(auVar194,auVar84);
  auVar255._0_4_ = auVar84._0_4_ + auVar194._0_4_ * fVar149;
  auVar255._4_4_ = auVar84._4_4_ + auVar194._4_4_ * fVar184;
  auVar255._8_4_ = auVar84._8_4_ + auVar194._8_4_ * fVar185;
  auVar255._12_4_ = auVar84._12_4_ + auVar194._12_4_ * fVar186;
  auVar84 = vsubps_avx(auVar268,auVar115);
  auVar269._0_4_ = fVar187 * auVar84._0_4_;
  auVar269._4_4_ = fVar207 * auVar84._4_4_;
  auVar269._8_4_ = fVar208 * auVar84._8_4_;
  auVar269._12_4_ = fVar209 * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar278,auVar115);
  auVar116._0_4_ = fVar187 * auVar84._0_4_;
  auVar116._4_4_ = fVar207 * auVar84._4_4_;
  auVar116._8_4_ = fVar208 * auVar84._8_4_;
  auVar116._12_4_ = fVar209 * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar291,auVar73);
  auVar189._0_4_ = fVar210 * auVar84._0_4_;
  auVar189._4_4_ = fVar234 * auVar84._4_4_;
  auVar189._8_4_ = fVar235 * auVar84._8_4_;
  auVar189._12_4_ = fVar236 * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar305,auVar73);
  auVar74._0_4_ = fVar210 * auVar84._0_4_;
  auVar74._4_4_ = fVar234 * auVar84._4_4_;
  auVar74._8_4_ = fVar235 * auVar84._8_4_;
  auVar74._12_4_ = fVar236 * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar315,auVar151);
  auVar212._0_4_ = fVar237 * auVar84._0_4_;
  auVar212._4_4_ = fVar251 * auVar84._4_4_;
  auVar212._8_4_ = fVar252 * auVar84._8_4_;
  auVar212._12_4_ = fVar253 * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar255,auVar151);
  auVar152._0_4_ = fVar237 * auVar84._0_4_;
  auVar152._4_4_ = fVar251 * auVar84._4_4_;
  auVar152._8_4_ = fVar252 * auVar84._8_4_;
  auVar152._12_4_ = fVar253 * auVar84._12_4_;
  auVar84 = vpminsd_avx(auVar269,auVar116);
  auVar194 = vpminsd_avx(auVar189,auVar74);
  auVar84 = vmaxps_avx(auVar84,auVar194);
  auVar194 = vpminsd_avx(auVar212,auVar152);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar279._4_4_ = uVar5;
  auVar279._0_4_ = uVar5;
  auVar279._8_4_ = uVar5;
  auVar279._12_4_ = uVar5;
  auVar194 = vmaxps_avx(auVar194,auVar279);
  auVar84 = vmaxps_avx(auVar84,auVar194);
  local_410._0_4_ = auVar84._0_4_ * 0.99999964;
  local_410._4_4_ = auVar84._4_4_ * 0.99999964;
  local_410._8_4_ = auVar84._8_4_ * 0.99999964;
  local_410._12_4_ = auVar84._12_4_ * 0.99999964;
  auVar84 = vpmaxsd_avx(auVar269,auVar116);
  auVar194 = vpmaxsd_avx(auVar189,auVar74);
  auVar84 = vminps_avx(auVar84,auVar194);
  auVar194 = vpmaxsd_avx(auVar212,auVar152);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar153._4_4_ = uVar5;
  auVar153._0_4_ = uVar5;
  auVar153._8_4_ = uVar5;
  auVar153._12_4_ = uVar5;
  auVar194 = vminps_avx(auVar194,auVar153);
  auVar84 = vminps_avx(auVar84,auVar194);
  auVar75._0_4_ = auVar84._0_4_ * 1.0000004;
  auVar75._4_4_ = auVar84._4_4_ * 1.0000004;
  auVar75._8_4_ = auVar84._8_4_ * 1.0000004;
  auVar75._12_4_ = auVar84._12_4_ * 1.0000004;
  auVar84 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar194 = vpcmpgtd_avx(auVar84,_DAT_01f7fcf0);
  auVar84 = vcmpps_avx(local_410,auVar75,2);
  auVar84 = vandps_avx(auVar84,auVar194);
  uVar62 = vmovmskps_avx(auVar84);
  if (uVar62 == 0) {
    return false;
  }
  uVar62 = uVar62 & 0xff;
  auVar107._16_16_ = mm_lookupmask_ps._240_16_;
  auVar107._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar107,ZEXT832(0) << 0x20,0x80);
  uVar63 = 1 << ((byte)k & 0x1f);
LAB_00f8cec6:
  lVar68 = 0;
  if (uVar62 != 0) {
    for (; (uVar62 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  uVar66 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar66].ptr;
  fVar149 = (pGVar8->time_range).lower;
  fVar210 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar149) / ((pGVar8->time_range).upper - fVar149));
  auVar84 = vroundss_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),9);
  auVar84 = vminss_avx(auVar84,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar179 = vmaxss_avx(ZEXT816(0) << 0x20,auVar84);
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar68 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar69 = (long)(int)auVar179._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + 0x10 + lVar69);
  pfVar2 = (float *)(*(long *)(_Var9 + lVar69) + lVar10 * uVar64);
  fVar234 = *pfVar2;
  fVar235 = pfVar2[1];
  fVar236 = pfVar2[2];
  fVar237 = pfVar2[3];
  lVar1 = uVar64 + 1;
  auVar84 = *(undefined1 (*) [16])(*(long *)(_Var9 + lVar69) + lVar10 * lVar1);
  p_Var11 = pGVar8[4].occlusionFilterN;
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar10 + 0x10 + lVar69);
  pfVar2 = (float *)(*(long *)(lVar10 + lVar69) + lVar12 * uVar64);
  fVar251 = *pfVar2;
  fVar252 = pfVar2[1];
  fVar253 = pfVar2[2];
  fVar150 = pfVar2[3];
  auVar194 = *(undefined1 (*) [16])(*(long *)(lVar10 + lVar69) + lVar12 * lVar1);
  _Var13 = pGVar8[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar4 = (float *)(*(long *)(p_Var11 + lVar69) + *(long *)(p_Var11 + lVar69 + 0x10) * uVar64);
  pfVar2 = (float *)(*(long *)(p_Var11 + lVar69) + *(long *)(p_Var11 + lVar69 + 0x10) * lVar1);
  auVar270._0_4_ = *pfVar2 * 0.33333334;
  auVar270._4_4_ = pfVar2[1] * 0.33333334;
  auVar270._8_4_ = pfVar2[2] * 0.33333334;
  auVar270._12_4_ = pfVar2[3] * 0.33333334;
  lVar12 = *(long *)(_Var13 + 0x10 + lVar69);
  pfVar2 = (float *)(*(long *)(_Var13 + lVar69) + lVar12 * uVar64);
  fVar210 = fVar210 - auVar179._0_4_;
  fVar314 = fVar234 + *pfVar4 * 0.33333334;
  fVar322 = fVar235 + pfVar4[1] * 0.33333334;
  fVar323 = fVar236 + pfVar4[2] * 0.33333334;
  fVar324 = fVar237 + pfVar4[3] * 0.33333334;
  auVar179 = vsubps_avx(auVar84,auVar270);
  fVar304 = *pfVar2 * 0.33333334 + fVar251;
  fVar311 = pfVar2[1] * 0.33333334 + fVar252;
  fVar312 = pfVar2[2] * 0.33333334 + fVar253;
  fVar313 = pfVar2[3] * 0.33333334 + fVar150;
  pfVar2 = (float *)(*(long *)(_Var13 + lVar69) + lVar12 * lVar1);
  auVar76._0_4_ = *pfVar2 * 0.33333334;
  auVar76._4_4_ = pfVar2[1] * 0.33333334;
  auVar76._8_4_ = pfVar2[2] * 0.33333334;
  auVar76._12_4_ = pfVar2[3] * 0.33333334;
  auVar281 = vsubps_avx(auVar194,auVar76);
  fVar149 = auVar84._0_4_;
  fVar185 = auVar84._4_4_;
  fVar187 = auVar84._8_4_;
  fVar208 = auVar84._12_4_;
  fVar325 = auVar179._0_4_ * 0.0;
  fVar330 = auVar179._4_4_ * 0.0;
  fVar331 = auVar179._8_4_ * 0.0;
  fVar332 = auVar179._12_4_ * 0.0;
  fVar347 = fVar325 + fVar149 * 0.0;
  fVar356 = fVar330 + fVar185 * 0.0;
  fVar357 = fVar331 + fVar187 * 0.0;
  fVar358 = fVar332 + fVar208 * 0.0;
  auVar77._0_4_ = fVar347 + fVar314 * 3.0;
  auVar77._4_4_ = fVar356 + fVar322 * 3.0;
  auVar77._8_4_ = fVar357 + fVar323 * 3.0;
  auVar77._12_4_ = fVar358 + fVar324 * 3.0;
  auVar117._0_4_ = fVar234 * 3.0;
  auVar117._4_4_ = fVar235 * 3.0;
  auVar117._8_4_ = fVar236 * 3.0;
  auVar117._12_4_ = fVar237 * 3.0;
  auVar128 = vsubps_avx(auVar77,auVar117);
  fVar184 = auVar194._0_4_;
  fVar186 = auVar194._4_4_;
  fVar207 = auVar194._8_4_;
  fVar209 = auVar194._12_4_;
  fVar337 = auVar281._0_4_ * 0.0;
  fVar343 = auVar281._4_4_ * 0.0;
  fVar344 = auVar281._8_4_ * 0.0;
  fVar345 = auVar281._12_4_ * 0.0;
  fVar359 = fVar337 + fVar184 * 0.0;
  fVar362 = fVar343 + fVar186 * 0.0;
  fVar364 = fVar344 + fVar207 * 0.0;
  fVar367 = fVar345 + fVar209 * 0.0;
  auVar78._0_4_ = fVar359 + fVar304 * 3.0;
  auVar78._4_4_ = fVar362 + fVar311 * 3.0;
  auVar78._8_4_ = fVar364 + fVar312 * 3.0;
  auVar78._12_4_ = fVar367 + fVar313 * 3.0;
  auVar280._0_4_ = fVar251 * 3.0;
  auVar280._4_4_ = fVar252 * 3.0;
  auVar280._8_4_ = fVar253 * 3.0;
  auVar280._12_4_ = fVar150 * 3.0;
  auVar15 = vsubps_avx(auVar78,auVar280);
  lVar12 = *(long *)(_Var9 + 0x38 + lVar69);
  lVar14 = *(long *)(_Var9 + 0x48 + lVar69);
  puVar3 = (undefined8 *)(lVar12 + lVar14 * uVar64);
  uVar6 = *puVar3;
  uVar54 = puVar3[1];
  fVar314 = fVar314 * 0.0;
  fVar322 = fVar322 * 0.0;
  fVar323 = fVar323 * 0.0;
  fVar324 = fVar324 * 0.0;
  auVar316._0_4_ = fVar347 + fVar314 + fVar234;
  auVar316._4_4_ = fVar356 + fVar322 + fVar235;
  auVar316._8_4_ = fVar357 + fVar323 + fVar236;
  auVar316._12_4_ = fVar358 + fVar324 + fVar237;
  fVar304 = fVar304 * 0.0;
  fVar311 = fVar311 * 0.0;
  fVar312 = fVar312 * 0.0;
  fVar313 = fVar313 * 0.0;
  auVar361._0_4_ = fVar304 + fVar359 + fVar251;
  auVar361._4_4_ = fVar311 + fVar362 + fVar252;
  auVar361._8_4_ = fVar312 + fVar364 + fVar253;
  auVar361._12_4_ = fVar313 + fVar367 + fVar150;
  auVar154._0_4_ = fVar234 * 0.0;
  auVar154._4_4_ = fVar235 * 0.0;
  auVar154._8_4_ = fVar236 * 0.0;
  auVar154._12_4_ = fVar237 * 0.0;
  auVar306._0_4_ = fVar325 + fVar149 + fVar314 + auVar154._0_4_;
  auVar306._4_4_ = fVar330 + fVar185 + fVar322 + auVar154._4_4_;
  auVar306._8_4_ = fVar331 + fVar187 + fVar323 + auVar154._8_4_;
  auVar306._12_4_ = fVar332 + fVar208 + fVar324 + auVar154._12_4_;
  auVar190._0_4_ = fVar149 * 3.0;
  auVar190._4_4_ = fVar185 * 3.0;
  auVar190._8_4_ = fVar187 * 3.0;
  auVar190._12_4_ = fVar208 * 3.0;
  auVar271._0_4_ = auVar179._0_4_ * 3.0;
  auVar271._4_4_ = auVar179._4_4_ * 3.0;
  auVar271._8_4_ = auVar179._8_4_ * 3.0;
  auVar271._12_4_ = auVar179._12_4_ * 3.0;
  auVar84 = vsubps_avx(auVar190,auVar271);
  auVar79._0_4_ = fVar314 + auVar84._0_4_;
  auVar79._4_4_ = fVar322 + auVar84._4_4_;
  auVar79._8_4_ = fVar323 + auVar84._8_4_;
  auVar79._12_4_ = fVar324 + auVar84._12_4_;
  auVar169 = vsubps_avx(auVar79,auVar154);
  auVar155._0_4_ = fVar251 * 0.0;
  auVar155._4_4_ = fVar252 * 0.0;
  auVar155._8_4_ = fVar253 * 0.0;
  auVar155._12_4_ = fVar150 * 0.0;
  auVar80._0_4_ = auVar155._0_4_ + fVar304 + fVar337 + fVar184;
  auVar80._4_4_ = auVar155._4_4_ + fVar311 + fVar343 + fVar186;
  auVar80._8_4_ = auVar155._8_4_ + fVar312 + fVar344 + fVar207;
  auVar80._12_4_ = auVar155._12_4_ + fVar313 + fVar345 + fVar209;
  auVar191._0_4_ = fVar184 * 3.0;
  auVar191._4_4_ = fVar186 * 3.0;
  auVar191._8_4_ = fVar207 * 3.0;
  auVar191._12_4_ = fVar209 * 3.0;
  auVar213._0_4_ = auVar281._0_4_ * 3.0;
  auVar213._4_4_ = auVar281._4_4_ * 3.0;
  auVar213._8_4_ = auVar281._8_4_ * 3.0;
  auVar213._12_4_ = auVar281._12_4_ * 3.0;
  auVar84 = vsubps_avx(auVar191,auVar213);
  auVar192._0_4_ = fVar304 + auVar84._0_4_;
  auVar192._4_4_ = fVar311 + auVar84._4_4_;
  auVar192._8_4_ = fVar312 + auVar84._8_4_;
  auVar192._12_4_ = fVar313 + auVar84._12_4_;
  auVar139 = vsubps_avx(auVar192,auVar155);
  auVar84 = vshufps_avx(auVar128,auVar128,0xc9);
  auVar194 = vshufps_avx(auVar361,auVar361,0xc9);
  fVar234 = auVar128._0_4_;
  auVar214._0_4_ = fVar234 * auVar194._0_4_;
  fVar236 = auVar128._4_4_;
  auVar214._4_4_ = fVar236 * auVar194._4_4_;
  fVar252 = auVar128._8_4_;
  auVar214._8_4_ = fVar252 * auVar194._8_4_;
  fVar314 = auVar128._12_4_;
  auVar214._12_4_ = fVar314 * auVar194._12_4_;
  auVar239._0_4_ = auVar361._0_4_ * auVar84._0_4_;
  auVar239._4_4_ = auVar361._4_4_ * auVar84._4_4_;
  auVar239._8_4_ = auVar361._8_4_ * auVar84._8_4_;
  auVar239._12_4_ = auVar361._12_4_ * auVar84._12_4_;
  auVar194 = vsubps_avx(auVar239,auVar214);
  auVar179 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar194 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar215._0_4_ = fVar234 * auVar194._0_4_;
  auVar215._4_4_ = fVar236 * auVar194._4_4_;
  auVar215._8_4_ = fVar252 * auVar194._8_4_;
  auVar215._12_4_ = fVar314 * auVar194._12_4_;
  auVar156._0_4_ = auVar15._0_4_ * auVar84._0_4_;
  auVar156._4_4_ = auVar15._4_4_ * auVar84._4_4_;
  auVar156._8_4_ = auVar15._8_4_ * auVar84._8_4_;
  auVar156._12_4_ = auVar15._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar156,auVar215);
  auVar281 = vshufps_avx(auVar84,auVar84,0xc9);
  auVar194 = vshufps_avx(auVar169,auVar169,0xc9);
  auVar84 = vshufps_avx(auVar80,auVar80,0xc9);
  fVar347 = auVar169._0_4_;
  auVar157._0_4_ = fVar347 * auVar84._0_4_;
  fVar356 = auVar169._4_4_;
  auVar157._4_4_ = fVar356 * auVar84._4_4_;
  fVar357 = auVar169._8_4_;
  auVar157._8_4_ = fVar357 * auVar84._8_4_;
  fVar358 = auVar169._12_4_;
  auVar157._12_4_ = fVar358 * auVar84._12_4_;
  auVar81._0_4_ = auVar194._0_4_ * auVar80._0_4_;
  auVar81._4_4_ = auVar194._4_4_ * auVar80._4_4_;
  auVar81._8_4_ = auVar194._8_4_ * auVar80._8_4_;
  auVar81._12_4_ = auVar194._12_4_ * auVar80._12_4_;
  auVar84 = vsubps_avx(auVar81,auVar157);
  auVar15 = vshufps_avx(auVar84,auVar84,0xc9);
  auVar163 = vshufps_avx(auVar139,auVar139,0xc9);
  auVar84 = vdpps_avx(auVar179,auVar179,0x7f);
  auVar82._0_4_ = fVar347 * auVar163._0_4_;
  auVar82._4_4_ = fVar356 * auVar163._4_4_;
  auVar82._8_4_ = fVar357 * auVar163._8_4_;
  auVar82._12_4_ = fVar358 * auVar163._12_4_;
  auVar193._0_4_ = auVar194._0_4_ * auVar139._0_4_;
  auVar193._4_4_ = auVar194._4_4_ * auVar139._4_4_;
  auVar193._8_4_ = auVar194._8_4_ * auVar139._8_4_;
  auVar193._12_4_ = auVar194._12_4_ * auVar139._12_4_;
  auVar139 = vsubps_avx(auVar193,auVar82);
  fVar184 = auVar84._0_4_;
  auVar83 = ZEXT416((uint)fVar184);
  auVar194 = vrsqrtss_avx(auVar83,auVar83);
  fVar149 = auVar194._0_4_;
  auVar194 = ZEXT416((uint)(fVar149 * 1.5 - fVar184 * 0.5 * fVar149 * fVar149 * fVar149));
  auVar163 = vshufps_avx(auVar194,auVar194,0);
  auVar194 = vdpps_avx(auVar179,auVar281,0x7f);
  fVar187 = auVar163._0_4_ * auVar179._0_4_;
  fVar207 = auVar163._4_4_ * auVar179._4_4_;
  fVar208 = auVar163._8_4_ * auVar179._8_4_;
  fVar209 = auVar163._12_4_ * auVar179._12_4_;
  auVar84 = vshufps_avx(auVar84,auVar84,0);
  auVar256._0_4_ = auVar84._0_4_ * auVar281._0_4_;
  auVar256._4_4_ = auVar84._4_4_ * auVar281._4_4_;
  auVar256._8_4_ = auVar84._8_4_ * auVar281._8_4_;
  auVar256._12_4_ = auVar84._12_4_ * auVar281._12_4_;
  auVar84 = vshufps_avx(auVar194,auVar194,0);
  auVar240._0_4_ = auVar84._0_4_ * auVar179._0_4_;
  auVar240._4_4_ = auVar84._4_4_ * auVar179._4_4_;
  auVar240._8_4_ = auVar84._8_4_ * auVar179._8_4_;
  auVar240._12_4_ = auVar84._12_4_ * auVar179._12_4_;
  auVar129 = vsubps_avx(auVar256,auVar240);
  auVar84 = vrcpss_avx(auVar83,auVar83);
  auVar84 = ZEXT416((uint)(auVar84._0_4_ * (2.0 - fVar184 * auVar84._0_4_)));
  auVar179 = vshufps_avx(auVar84,auVar84,0);
  auVar194 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar235 = auVar194._0_4_;
  auVar272 = ZEXT416((uint)fVar235);
  auVar84 = vrsqrtss_avx(auVar272,auVar272);
  fVar149 = auVar84._0_4_;
  auVar84 = *(undefined1 (*) [16])(lVar12 + lVar14 * lVar1);
  pfVar2 = (float *)(*(long *)(p_Var11 + lVar69 + 0x38) +
                    *(long *)(p_Var11 + lVar69 + 0x48) * uVar64);
  auVar281 = vshufps_avx(auVar139,auVar139,0xc9);
  auVar194 = vshufps_avx(auVar194,auVar194,0);
  auVar348._0_4_ = auVar194._0_4_ * auVar281._0_4_;
  auVar348._4_4_ = auVar194._4_4_ * auVar281._4_4_;
  auVar348._8_4_ = auVar194._8_4_ * auVar281._8_4_;
  auVar348._12_4_ = auVar194._12_4_ * auVar281._12_4_;
  auVar194 = vdpps_avx(auVar15,auVar281,0x7f);
  auVar281 = ZEXT416((uint)(fVar149 * 1.5 - fVar149 * fVar149 * fVar149 * fVar235 * 0.5));
  auVar281 = vshufps_avx(auVar281,auVar281,0);
  auVar194 = vshufps_avx(auVar194,auVar194,0);
  auVar216._0_4_ = auVar194._0_4_ * auVar15._0_4_;
  auVar216._4_4_ = auVar194._4_4_ * auVar15._4_4_;
  auVar216._8_4_ = auVar194._8_4_ * auVar15._8_4_;
  auVar216._12_4_ = auVar194._12_4_ * auVar15._12_4_;
  fVar149 = auVar281._0_4_ * auVar15._0_4_;
  fVar184 = auVar281._4_4_ * auVar15._4_4_;
  fVar185 = auVar281._8_4_ * auVar15._8_4_;
  fVar186 = auVar281._12_4_ * auVar15._12_4_;
  auVar83 = vsubps_avx(auVar348,auVar216);
  auVar194 = vrcpss_avx(auVar272,auVar272);
  auVar194 = ZEXT416((uint)(auVar194._0_4_ * (2.0 - fVar235 * auVar194._0_4_)));
  auVar194 = vshufps_avx(auVar194,auVar194,0);
  auVar15 = vshufps_avx(auVar316,auVar316,0xff);
  auVar349._0_4_ = auVar15._0_4_ * fVar187;
  auVar349._4_4_ = auVar15._4_4_ * fVar207;
  auVar349._8_4_ = auVar15._8_4_ * fVar208;
  auVar349._12_4_ = auVar15._12_4_ * fVar209;
  auVar272 = vsubps_avx(auVar316,auVar349);
  auVar139 = vshufps_avx(auVar128,auVar128,0xff);
  auVar195._0_4_ =
       auVar139._0_4_ * fVar187 + auVar15._0_4_ * auVar163._0_4_ * auVar179._0_4_ * auVar129._0_4_;
  auVar195._4_4_ =
       auVar139._4_4_ * fVar207 + auVar15._4_4_ * auVar163._4_4_ * auVar179._4_4_ * auVar129._4_4_;
  auVar195._8_4_ =
       auVar139._8_4_ * fVar208 + auVar15._8_4_ * auVar163._8_4_ * auVar179._8_4_ * auVar129._8_4_;
  auVar195._12_4_ =
       auVar139._12_4_ * fVar209 +
       auVar15._12_4_ * auVar163._12_4_ * auVar179._12_4_ * auVar129._12_4_;
  auVar139 = vsubps_avx(auVar128,auVar195);
  auVar179 = vshufps_avx(auVar306,auVar306,0xff);
  auVar241._0_4_ = auVar179._0_4_ * fVar149;
  auVar241._4_4_ = auVar179._4_4_ * fVar184;
  auVar241._8_4_ = auVar179._8_4_ * fVar185;
  auVar241._12_4_ = auVar179._12_4_ * fVar186;
  auVar128 = vsubps_avx(auVar306,auVar241);
  auVar15 = vshufps_avx(auVar169,auVar169,0xff);
  auVar118._0_4_ =
       auVar15._0_4_ * fVar149 + auVar179._0_4_ * auVar281._0_4_ * auVar83._0_4_ * auVar194._0_4_;
  auVar118._4_4_ =
       auVar15._4_4_ * fVar184 + auVar179._4_4_ * auVar281._4_4_ * auVar83._4_4_ * auVar194._4_4_;
  auVar118._8_4_ =
       auVar15._8_4_ * fVar185 + auVar179._8_4_ * auVar281._8_4_ * auVar83._8_4_ * auVar194._8_4_;
  auVar118._12_4_ =
       auVar15._12_4_ * fVar186 +
       auVar179._12_4_ * auVar281._12_4_ * auVar83._12_4_ * auVar194._12_4_;
  auVar169 = vsubps_avx(auVar169,auVar118);
  local_620._4_4_ = auVar306._4_4_ + auVar241._4_4_;
  local_620._0_4_ = auVar306._0_4_ + auVar241._0_4_;
  fStack_618 = auVar306._8_4_ + auVar241._8_4_;
  fStack_614 = auVar306._12_4_ + auVar241._12_4_;
  local_700._0_4_ = (undefined4)uVar6;
  local_700._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
  fStack_6f8 = (float)uVar54;
  fStack_6f4 = (float)((ulong)uVar54 >> 0x20);
  fVar337 = (float)local_700._0_4_ + *pfVar2 * 0.33333334;
  fVar343 = (float)local_700._4_4_ + pfVar2[1] * 0.33333334;
  fVar344 = fStack_6f8 + pfVar2[2] * 0.33333334;
  fVar345 = fStack_6f4 + pfVar2[3] * 0.33333334;
  pfVar2 = (float *)(*(long *)(p_Var11 + lVar69 + 0x38) + *(long *)(p_Var11 + lVar69 + 0x48) * lVar1
                    );
  auVar85._0_4_ = *pfVar2 * 0.33333334;
  auVar85._4_4_ = pfVar2[1] * 0.33333334;
  auVar85._8_4_ = pfVar2[2] * 0.33333334;
  auVar85._12_4_ = pfVar2[3] * 0.33333334;
  auVar194 = vsubps_avx(auVar84,auVar85);
  fVar359 = auVar84._0_4_;
  fVar362 = auVar84._4_4_;
  fVar364 = auVar84._8_4_;
  fVar367 = auVar84._12_4_;
  fVar325 = auVar194._0_4_ * 0.0;
  fVar330 = auVar194._4_4_ * 0.0;
  fVar331 = auVar194._8_4_ * 0.0;
  fVar332 = auVar194._12_4_ * 0.0;
  fVar360 = fVar359 * 0.0 + fVar325;
  fVar363 = fVar362 * 0.0 + fVar330;
  fVar365 = fVar364 * 0.0 + fVar331;
  fVar368 = fVar367 * 0.0 + fVar332;
  auVar119._0_4_ = fVar360 + fVar337 * 3.0;
  auVar119._4_4_ = fVar363 + fVar343 * 3.0;
  auVar119._8_4_ = fVar365 + fVar344 * 3.0;
  auVar119._12_4_ = fVar368 + fVar345 * 3.0;
  auVar158._0_4_ = (float)local_700._0_4_ * 3.0;
  auVar158._4_4_ = (float)local_700._4_4_ * 3.0;
  auVar158._8_4_ = fStack_6f8 * 3.0;
  auVar158._12_4_ = fStack_6f4 * 3.0;
  auVar129 = vsubps_avx(auVar119,auVar158);
  lVar12 = *(long *)(lVar10 + 0x38 + lVar69);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar69);
  lVar14 = *(long *)(_Var13 + 0x38 + lVar69);
  lVar69 = *(long *)(_Var13 + 0x48 + lVar69);
  pfVar2 = (float *)(lVar12 + lVar10 * uVar64);
  fVar149 = *pfVar2;
  fVar184 = pfVar2[1];
  fVar185 = pfVar2[2];
  fVar186 = pfVar2[3];
  pfVar2 = (float *)(lVar14 + uVar64 * lVar69);
  fVar304 = fVar149 + *pfVar2 * 0.33333334;
  fVar311 = fVar184 + pfVar2[1] * 0.33333334;
  fVar312 = fVar185 + pfVar2[2] * 0.33333334;
  fVar313 = fVar186 + pfVar2[3] * 0.33333334;
  auVar84 = *(undefined1 (*) [16])(lVar12 + lVar10 * lVar1);
  pfVar2 = (float *)(lVar14 + lVar69 * lVar1);
  auVar159._0_4_ = *pfVar2 * 0.33333334;
  auVar159._4_4_ = pfVar2[1] * 0.33333334;
  auVar159._8_4_ = pfVar2[2] * 0.33333334;
  auVar159._12_4_ = pfVar2[3] * 0.33333334;
  auVar179 = vsubps_avx(auVar84,auVar159);
  fVar187 = auVar84._0_4_;
  fVar207 = auVar84._4_4_;
  fVar208 = auVar84._8_4_;
  fVar209 = auVar84._12_4_;
  fVar235 = auVar179._0_4_ * 0.0;
  fVar237 = auVar179._4_4_ * 0.0;
  fVar251 = auVar179._8_4_ * 0.0;
  fVar253 = auVar179._12_4_ * 0.0;
  fVar150 = fVar187 * 0.0 + fVar235;
  fVar322 = fVar207 * 0.0 + fVar237;
  fVar323 = fVar208 * 0.0 + fVar251;
  fVar324 = fVar209 * 0.0 + fVar253;
  auVar257._0_4_ = fVar304 * 3.0 + fVar150;
  auVar257._4_4_ = fVar311 * 3.0 + fVar322;
  auVar257._8_4_ = fVar312 * 3.0 + fVar323;
  auVar257._12_4_ = fVar313 * 3.0 + fVar324;
  auVar282._0_4_ = fVar149 * 3.0;
  auVar282._4_4_ = fVar184 * 3.0;
  auVar282._8_4_ = fVar185 * 3.0;
  auVar282._12_4_ = fVar186 * 3.0;
  auVar281 = vsubps_avx(auVar257,auVar282);
  auVar283._0_4_ = fVar359 * 3.0;
  auVar283._4_4_ = fVar362 * 3.0;
  auVar283._8_4_ = fVar364 * 3.0;
  auVar283._12_4_ = fVar367 * 3.0;
  auVar327._0_4_ = auVar194._0_4_ * 3.0;
  auVar327._4_4_ = auVar194._4_4_ * 3.0;
  auVar327._8_4_ = auVar194._8_4_ * 3.0;
  auVar327._12_4_ = auVar194._12_4_ * 3.0;
  auVar84 = vsubps_avx(auVar283,auVar327);
  fVar337 = fVar337 * 0.0;
  fVar343 = fVar343 * 0.0;
  fVar344 = fVar344 * 0.0;
  fVar345 = fVar345 * 0.0;
  auVar284._0_4_ = fVar337 + auVar84._0_4_;
  auVar284._4_4_ = fVar343 + auVar84._4_4_;
  auVar284._8_4_ = fVar344 + auVar84._8_4_;
  auVar284._12_4_ = fVar345 + auVar84._12_4_;
  auVar328._0_4_ = (float)local_700._0_4_ + fVar337 + fVar360;
  auVar328._4_4_ = (float)local_700._4_4_ + fVar343 + fVar363;
  auVar328._8_4_ = fStack_6f8 + fVar344 + fVar365;
  auVar328._12_4_ = fStack_6f4 + fVar345 + fVar368;
  auVar292._0_4_ = (float)local_700._0_4_ * 0.0;
  auVar292._4_4_ = (float)local_700._4_4_ * 0.0;
  auVar292._8_4_ = fStack_6f8 * 0.0;
  auVar292._12_4_ = fStack_6f4 * 0.0;
  local_700._0_4_ = auVar292._0_4_ + fVar337 + fVar359 + fVar325;
  local_700._4_4_ = auVar292._4_4_ + fVar343 + fVar362 + fVar330;
  fStack_6f8 = auVar292._8_4_ + fVar344 + fVar364 + fVar331;
  fStack_6f4 = auVar292._12_4_ + fVar345 + fVar367 + fVar332;
  auVar83 = vsubps_avx(auVar284,auVar292);
  auVar86._0_4_ = fVar187 * 3.0;
  auVar86._4_4_ = fVar207 * 3.0;
  auVar86._8_4_ = fVar208 * 3.0;
  auVar86._12_4_ = fVar209 * 3.0;
  auVar196._0_4_ = auVar179._0_4_ * 3.0;
  auVar196._4_4_ = auVar179._4_4_ * 3.0;
  auVar196._8_4_ = auVar179._8_4_ * 3.0;
  auVar196._12_4_ = auVar179._12_4_ * 3.0;
  auVar84 = vsubps_avx(auVar86,auVar196);
  fVar304 = fVar304 * 0.0;
  fVar311 = fVar311 * 0.0;
  fVar312 = fVar312 * 0.0;
  fVar313 = fVar313 * 0.0;
  auVar87._0_4_ = fVar304 + auVar84._0_4_;
  auVar87._4_4_ = fVar311 + auVar84._4_4_;
  auVar87._8_4_ = fVar312 + auVar84._8_4_;
  auVar87._12_4_ = fVar313 + auVar84._12_4_;
  auVar160._0_4_ = fVar149 + fVar304 + fVar150;
  auVar160._4_4_ = fVar184 + fVar311 + fVar322;
  auVar160._8_4_ = fVar185 + fVar312 + fVar323;
  auVar160._12_4_ = fVar186 + fVar313 + fVar324;
  auVar197._0_4_ = fVar149 * 0.0;
  auVar197._4_4_ = fVar184 * 0.0;
  auVar197._8_4_ = fVar185 * 0.0;
  auVar197._12_4_ = fVar186 * 0.0;
  auVar120._0_4_ = auVar197._0_4_ + fVar304 + fVar187 + fVar235;
  auVar120._4_4_ = auVar197._4_4_ + fVar311 + fVar207 + fVar237;
  auVar120._8_4_ = auVar197._8_4_ + fVar312 + fVar208 + fVar251;
  auVar120._12_4_ = auVar197._12_4_ + fVar313 + fVar209 + fVar253;
  auVar194 = vsubps_avx(auVar87,auVar197);
  auVar84 = vshufps_avx(auVar160,auVar160,0xc9);
  fVar324 = auVar129._0_4_;
  auVar198._0_4_ = fVar324 * auVar84._0_4_;
  fVar311 = auVar129._4_4_;
  auVar198._4_4_ = fVar311 * auVar84._4_4_;
  fVar312 = auVar129._8_4_;
  auVar198._8_4_ = fVar312 * auVar84._8_4_;
  fVar313 = auVar129._12_4_;
  auVar198._12_4_ = fVar313 * auVar84._12_4_;
  auVar84 = vshufps_avx(auVar129,auVar129,0xc9);
  auVar161._0_4_ = auVar84._0_4_ * auVar160._0_4_;
  auVar161._4_4_ = auVar84._4_4_ * auVar160._4_4_;
  auVar161._8_4_ = auVar84._8_4_ * auVar160._8_4_;
  auVar161._12_4_ = auVar84._12_4_ * auVar160._12_4_;
  auVar179 = vsubps_avx(auVar161,auVar198);
  auVar199._0_4_ = auVar84._0_4_ * auVar281._0_4_;
  auVar199._4_4_ = auVar84._4_4_ * auVar281._4_4_;
  auVar199._8_4_ = auVar84._8_4_ * auVar281._8_4_;
  auVar199._12_4_ = auVar84._12_4_ * auVar281._12_4_;
  auVar84 = vshufps_avx(auVar281,auVar281,0xc9);
  auVar217._0_4_ = fVar324 * auVar84._0_4_;
  auVar217._4_4_ = fVar311 * auVar84._4_4_;
  auVar217._8_4_ = fVar312 * auVar84._8_4_;
  auVar217._12_4_ = fVar313 * auVar84._12_4_;
  auVar281 = vsubps_avx(auVar199,auVar217);
  auVar84 = vshufps_avx(auVar120,auVar120,0xc9);
  fVar235 = auVar83._0_4_;
  auVar218._0_4_ = fVar235 * auVar84._0_4_;
  fVar251 = auVar83._4_4_;
  auVar218._4_4_ = fVar251 * auVar84._4_4_;
  fVar150 = auVar83._8_4_;
  auVar218._8_4_ = fVar150 * auVar84._8_4_;
  fVar323 = auVar83._12_4_;
  auVar218._12_4_ = fVar323 * auVar84._12_4_;
  auVar84 = vshufps_avx(auVar83,auVar83,0xc9);
  auVar121._0_4_ = auVar84._0_4_ * auVar120._0_4_;
  auVar121._4_4_ = auVar84._4_4_ * auVar120._4_4_;
  auVar121._8_4_ = auVar84._8_4_ * auVar120._8_4_;
  auVar121._12_4_ = auVar84._12_4_ * auVar120._12_4_;
  auVar15 = vsubps_avx(auVar121,auVar218);
  auVar179 = vshufps_avx(auVar179,auVar179,0xc9);
  auVar162._0_4_ = auVar84._0_4_ * auVar194._0_4_;
  auVar162._4_4_ = auVar84._4_4_ * auVar194._4_4_;
  auVar162._8_4_ = auVar84._8_4_ * auVar194._8_4_;
  auVar162._12_4_ = auVar84._12_4_ * auVar194._12_4_;
  auVar84 = vdpps_avx(auVar179,auVar179,0x7f);
  auVar194 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar88._0_4_ = fVar235 * auVar194._0_4_;
  auVar88._4_4_ = fVar251 * auVar194._4_4_;
  auVar88._8_4_ = fVar150 * auVar194._8_4_;
  auVar88._12_4_ = fVar323 * auVar194._12_4_;
  auVar73 = vsubps_avx(auVar162,auVar88);
  fVar149 = auVar84._0_4_;
  auVar163 = ZEXT416((uint)fVar149);
  auVar194 = vrsqrtss_avx(auVar163,auVar163);
  fVar184 = auVar194._0_4_;
  auVar281 = vshufps_avx(auVar281,auVar281,0xc9);
  auVar194 = vdpps_avx(auVar179,auVar281,0x7f);
  auVar84 = vshufps_avx(auVar84,auVar84,0);
  auVar200._0_4_ = auVar84._0_4_ * auVar281._0_4_;
  auVar200._4_4_ = auVar84._4_4_ * auVar281._4_4_;
  auVar200._8_4_ = auVar84._8_4_ * auVar281._8_4_;
  auVar200._12_4_ = auVar84._12_4_ * auVar281._12_4_;
  auVar84 = vshufps_avx(auVar194,auVar194,0);
  auVar258._0_4_ = auVar179._0_4_ * auVar84._0_4_;
  auVar258._4_4_ = auVar179._4_4_ * auVar84._4_4_;
  auVar258._8_4_ = auVar179._8_4_ * auVar84._8_4_;
  auVar258._12_4_ = auVar179._12_4_ * auVar84._12_4_;
  auVar74 = vsubps_avx(auVar200,auVar258);
  auVar84 = vrcpss_avx(auVar163,auVar163);
  auVar84 = ZEXT416((uint)(auVar84._0_4_ * (2.0 - fVar149 * auVar84._0_4_)));
  auVar281 = vshufps_avx(auVar84,auVar84,0);
  auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar84 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar194 = ZEXT416((uint)(fVar184 * 1.5 - fVar184 * fVar184 * fVar149 * 0.5 * fVar184));
  auVar163 = vshufps_avx(auVar194,auVar194,0);
  fVar149 = auVar179._0_4_ * auVar163._0_4_;
  fVar184 = auVar179._4_4_ * auVar163._4_4_;
  fVar185 = auVar179._8_4_ * auVar163._8_4_;
  fVar186 = auVar179._12_4_ * auVar163._12_4_;
  fVar187 = auVar84._0_4_;
  auVar75 = ZEXT416((uint)fVar187);
  auVar194 = vrsqrtss_avx(auVar75,auVar75);
  fVar207 = auVar194._0_4_;
  auVar179 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar194 = vdpps_avx(auVar15,auVar179,0x7f);
  auVar84 = vshufps_avx(auVar84,auVar84,0);
  auVar89._0_4_ = auVar84._0_4_ * auVar179._0_4_;
  auVar89._4_4_ = auVar84._4_4_ * auVar179._4_4_;
  auVar89._8_4_ = auVar84._8_4_ * auVar179._8_4_;
  auVar89._12_4_ = auVar84._12_4_ * auVar179._12_4_;
  auVar84 = vshufps_avx(auVar194,auVar194,0);
  auVar259._0_4_ = auVar84._0_4_ * auVar15._0_4_;
  auVar259._4_4_ = auVar84._4_4_ * auVar15._4_4_;
  auVar259._8_4_ = auVar84._8_4_ * auVar15._8_4_;
  auVar259._12_4_ = auVar84._12_4_ * auVar15._12_4_;
  auVar73 = vsubps_avx(auVar89,auVar259);
  auVar84 = vrcpss_avx(auVar75,auVar75);
  auVar84 = ZEXT416((uint)(auVar84._0_4_ * (2.0 - fVar187 * auVar84._0_4_)));
  auVar84 = vshufps_avx(auVar84,auVar84,0);
  auVar194 = ZEXT416((uint)(fVar207 * 1.5 - fVar207 * fVar207 * fVar187 * 0.5 * fVar207));
  auVar194 = vshufps_avx(auVar194,auVar194,0);
  fVar187 = auVar15._0_4_ * auVar194._0_4_;
  fVar207 = auVar15._4_4_ * auVar194._4_4_;
  fVar208 = auVar15._8_4_ * auVar194._8_4_;
  fVar209 = auVar15._12_4_ * auVar194._12_4_;
  auVar179 = vshufps_avx(auVar129,auVar129,0xff);
  auVar15 = vshufps_avx(auVar328,auVar328,0xff);
  auVar122._0_4_ = auVar15._0_4_ * fVar149;
  auVar122._4_4_ = auVar15._4_4_ * fVar184;
  auVar122._8_4_ = auVar15._8_4_ * fVar185;
  auVar122._12_4_ = auVar15._12_4_ * fVar186;
  auVar164._0_4_ =
       auVar179._0_4_ * fVar149 + auVar163._0_4_ * auVar281._0_4_ * auVar74._0_4_ * auVar15._0_4_;
  auVar164._4_4_ =
       auVar179._4_4_ * fVar184 + auVar163._4_4_ * auVar281._4_4_ * auVar74._4_4_ * auVar15._4_4_;
  auVar164._8_4_ =
       auVar179._8_4_ * fVar185 + auVar163._8_4_ * auVar281._8_4_ * auVar74._8_4_ * auVar15._8_4_;
  auVar164._12_4_ =
       auVar179._12_4_ * fVar186 +
       auVar163._12_4_ * auVar281._12_4_ * auVar74._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar328,auVar122);
  auVar163 = vsubps_avx(auVar129,auVar164);
  auVar179 = vshufps_avx(auVar83,auVar83,0xff);
  auVar281 = vshufps_avx(_local_700,_local_700,0xff);
  auVar201._0_4_ = auVar281._0_4_ * fVar187;
  auVar201._4_4_ = auVar281._4_4_ * fVar207;
  auVar201._8_4_ = auVar281._8_4_ * fVar208;
  auVar201._12_4_ = auVar281._12_4_ * fVar209;
  auVar123._0_4_ =
       auVar179._0_4_ * fVar187 + auVar281._0_4_ * auVar194._0_4_ * auVar73._0_4_ * auVar84._0_4_;
  auVar123._4_4_ =
       auVar179._4_4_ * fVar207 + auVar281._4_4_ * auVar194._4_4_ * auVar73._4_4_ * auVar84._4_4_;
  auVar123._8_4_ =
       auVar179._8_4_ * fVar208 + auVar281._8_4_ * auVar194._8_4_ * auVar73._8_4_ * auVar84._8_4_;
  auVar123._12_4_ =
       auVar179._12_4_ * fVar209 +
       auVar281._12_4_ * auVar194._12_4_ * auVar73._12_4_ * auVar84._12_4_;
  auVar179 = vsubps_avx(_local_700,auVar201);
  auVar339._0_4_ = (float)local_700._0_4_ + auVar201._0_4_;
  auVar339._4_4_ = (float)local_700._4_4_ + auVar201._4_4_;
  auVar339._8_4_ = fStack_6f8 + auVar201._8_4_;
  auVar339._12_4_ = fStack_6f4 + auVar201._12_4_;
  auVar281 = vsubps_avx(auVar83,auVar123);
  local_600 = auVar139._0_4_;
  fStack_5fc = auVar139._4_4_;
  fStack_5f8 = auVar139._8_4_;
  fStack_5f4 = auVar139._12_4_;
  local_5e0 = auVar272._0_4_;
  fStack_5dc = auVar272._4_4_;
  fStack_5d8 = auVar272._8_4_;
  fStack_5d4 = auVar272._12_4_;
  auVar84 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
  auVar194 = vshufps_avx(ZEXT416((uint)(1.0 - fVar210)),ZEXT416((uint)(1.0 - fVar210)),0);
  fVar149 = auVar84._0_4_;
  fVar184 = auVar84._4_4_;
  fVar185 = auVar84._8_4_;
  fVar186 = auVar84._12_4_;
  fVar187 = auVar194._0_4_;
  fVar207 = auVar194._4_4_;
  fVar208 = auVar194._8_4_;
  fVar209 = auVar194._12_4_;
  local_4c0._0_4_ = fVar187 * local_5e0 + fVar149 * auVar15._0_4_;
  local_4c0._4_4_ = fVar207 * fStack_5dc + fVar184 * auVar15._4_4_;
  fStack_4b8 = fVar208 * fStack_5d8 + fVar185 * auVar15._8_4_;
  fStack_4b4 = fVar209 * fStack_5d4 + fVar186 * auVar15._12_4_;
  fVar237 = fVar187 * (local_5e0 + local_600 * 0.33333334) +
            fVar149 * (auVar15._0_4_ + auVar163._0_4_ * 0.33333334);
  fVar253 = fVar207 * (fStack_5dc + fStack_5fc * 0.33333334) +
            fVar184 * (auVar15._4_4_ + auVar163._4_4_ * 0.33333334);
  fVar322 = fVar208 * (fStack_5d8 + fStack_5f8 * 0.33333334) +
            fVar185 * (auVar15._8_4_ + auVar163._8_4_ * 0.33333334);
  fVar304 = fVar209 * (fStack_5d4 + fStack_5f4 * 0.33333334) +
            fVar186 * (auVar15._12_4_ + auVar163._12_4_ * 0.33333334);
  local_680 = auVar169._0_4_;
  fStack_67c = auVar169._4_4_;
  fStack_678 = auVar169._8_4_;
  fStack_674 = auVar169._12_4_;
  auVar219._0_4_ = local_680 * 0.33333334;
  auVar219._4_4_ = fStack_67c * 0.33333334;
  auVar219._8_4_ = fStack_678 * 0.33333334;
  auVar219._12_4_ = fStack_674 * 0.33333334;
  auVar84 = vsubps_avx(auVar128,auVar219);
  auVar260._0_4_ = (fVar347 + auVar118._0_4_) * 0.33333334;
  auVar260._4_4_ = (fVar356 + auVar118._4_4_) * 0.33333334;
  auVar260._8_4_ = (fVar357 + auVar118._8_4_) * 0.33333334;
  auVar260._12_4_ = (fVar358 + auVar118._12_4_) * 0.33333334;
  auVar194 = vsubps_avx(_local_620,auVar260);
  auVar202._0_4_ = auVar281._0_4_ * 0.33333334;
  auVar202._4_4_ = auVar281._4_4_ * 0.33333334;
  auVar202._8_4_ = auVar281._8_4_ * 0.33333334;
  auVar202._12_4_ = auVar281._12_4_ * 0.33333334;
  auVar281 = vsubps_avx(auVar179,auVar202);
  auVar124._0_4_ = (fVar235 + auVar123._0_4_) * 0.33333334;
  auVar124._4_4_ = (fVar251 + auVar123._4_4_) * 0.33333334;
  auVar124._8_4_ = (fVar150 + auVar123._8_4_) * 0.33333334;
  auVar124._12_4_ = (fVar323 + auVar123._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar339,auVar124);
  local_4d0._0_4_ = fVar187 * auVar84._0_4_ + fVar149 * auVar281._0_4_;
  local_4d0._4_4_ = fVar207 * auVar84._4_4_ + fVar184 * auVar281._4_4_;
  fStack_4c8 = fVar208 * auVar84._8_4_ + fVar185 * auVar281._8_4_;
  fStack_4c4 = fVar209 * auVar84._12_4_ + fVar186 * auVar281._12_4_;
  local_4e0._0_4_ = auVar179._0_4_ * fVar149 + fVar187 * auVar128._0_4_;
  local_4e0._4_4_ = auVar179._4_4_ * fVar184 + fVar207 * auVar128._4_4_;
  fStack_4d8 = auVar179._8_4_ * fVar185 + fVar208 * auVar128._8_4_;
  fStack_4d4 = auVar179._12_4_ * fVar186 + fVar209 * auVar128._12_4_;
  local_4f0._0_4_ =
       fVar187 * (auVar316._0_4_ + auVar349._0_4_) + fVar149 * (auVar328._0_4_ + auVar122._0_4_);
  local_4f0._4_4_ =
       fVar207 * (auVar316._4_4_ + auVar349._4_4_) + fVar184 * (auVar328._4_4_ + auVar122._4_4_);
  fStack_4e8 = fVar208 * (auVar316._8_4_ + auVar349._8_4_) +
               fVar185 * (auVar328._8_4_ + auVar122._8_4_);
  fStack_4e4 = fVar209 * (auVar316._12_4_ + auVar349._12_4_) +
               fVar186 * (auVar328._12_4_ + auVar122._12_4_);
  fVar251 = fVar187 * (auVar316._0_4_ + auVar349._0_4_ + (fVar234 + auVar195._0_4_) * 0.33333334) +
            ((fVar324 + auVar164._0_4_) * 0.33333334 + auVar328._0_4_ + auVar122._0_4_) * fVar149;
  fVar150 = fVar207 * (auVar316._4_4_ + auVar349._4_4_ + (fVar236 + auVar195._4_4_) * 0.33333334) +
            ((fVar311 + auVar164._4_4_) * 0.33333334 + auVar328._4_4_ + auVar122._4_4_) * fVar184;
  fVar323 = fVar208 * (auVar316._8_4_ + auVar349._8_4_ + (fVar252 + auVar195._8_4_) * 0.33333334) +
            ((fVar312 + auVar164._8_4_) * 0.33333334 + auVar328._8_4_ + auVar122._8_4_) * fVar185;
  fVar311 = fVar209 * (auVar316._12_4_ + auVar349._12_4_ + (fVar314 + auVar195._12_4_) * 0.33333334)
            + ((fVar313 + auVar164._12_4_) * 0.33333334 + auVar328._12_4_ + auVar122._12_4_) *
              fVar186;
  fVar252 = fVar187 * auVar194._0_4_ + fVar149 * auVar15._0_4_;
  fVar314 = fVar207 * auVar194._4_4_ + fVar184 * auVar15._4_4_;
  fVar324 = fVar208 * auVar194._8_4_ + fVar185 * auVar15._8_4_;
  fVar312 = fVar209 * auVar194._12_4_ + fVar186 * auVar15._12_4_;
  local_500 = fVar187 * (auVar306._0_4_ + auVar241._0_4_) + auVar339._0_4_ * fVar149;
  fStack_4fc = fVar207 * (auVar306._4_4_ + auVar241._4_4_) + auVar339._4_4_ * fVar184;
  fStack_4f8 = fVar208 * (auVar306._8_4_ + auVar241._8_4_) + auVar339._8_4_ * fVar185;
  fStack_4f4 = fVar209 * (auVar306._12_4_ + auVar241._12_4_) + auVar339._12_4_ * fVar186;
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_380 = vsubps_avx(_local_4c0,auVar84);
  auVar179 = vmovsldup_avx(local_380);
  auVar194 = vmovshdup_avx(local_380);
  auVar281 = vshufps_avx(local_380,local_380,0xaa);
  fVar149 = pre->ray_space[k].vx.field_0.m128[0];
  fVar184 = pre->ray_space[k].vx.field_0.m128[1];
  fVar185 = pre->ray_space[k].vx.field_0.m128[2];
  fVar186 = pre->ray_space[k].vx.field_0.m128[3];
  fVar187 = pre->ray_space[k].vy.field_0.m128[0];
  fVar207 = pre->ray_space[k].vy.field_0.m128[1];
  fVar208 = pre->ray_space[k].vy.field_0.m128[2];
  fVar209 = pre->ray_space[k].vy.field_0.m128[3];
  fVar210 = pre->ray_space[k].vz.field_0.m128[0];
  fVar234 = pre->ray_space[k].vz.field_0.m128[1];
  fVar235 = pre->ray_space[k].vz.field_0.m128[2];
  fVar236 = pre->ray_space[k].vz.field_0.m128[3];
  local_6f0._0_4_ = fVar149 * auVar179._0_4_ + fVar187 * auVar194._0_4_ + fVar210 * auVar281._0_4_;
  local_6f0._4_4_ = fVar184 * auVar179._4_4_ + fVar207 * auVar194._4_4_ + fVar234 * auVar281._4_4_;
  fStack_6e8 = fVar185 * auVar179._8_4_ + fVar208 * auVar194._8_4_ + fVar235 * auVar281._8_4_;
  fStack_6e4 = fVar186 * auVar179._12_4_ + fVar209 * auVar194._12_4_ + fVar236 * auVar281._12_4_;
  auVar59._4_4_ = fVar253;
  auVar59._0_4_ = fVar237;
  auVar59._8_4_ = fVar322;
  auVar59._12_4_ = fVar304;
  local_390 = vsubps_avx(auVar59,auVar84);
  auVar281 = vshufps_avx(local_390,local_390,0xaa);
  auVar194 = vmovshdup_avx(local_390);
  auVar179 = vmovsldup_avx(local_390);
  auVar350._0_4_ = fVar149 * auVar179._0_4_ + fVar187 * auVar194._0_4_ + fVar210 * auVar281._0_4_;
  auVar350._4_4_ = fVar184 * auVar179._4_4_ + fVar207 * auVar194._4_4_ + fVar234 * auVar281._4_4_;
  auVar350._8_4_ = fVar185 * auVar179._8_4_ + fVar208 * auVar194._8_4_ + fVar235 * auVar281._8_4_;
  auVar350._12_4_ =
       fVar186 * auVar179._12_4_ + fVar209 * auVar194._12_4_ + fVar236 * auVar281._12_4_;
  local_3a0 = vsubps_avx(_local_4d0,auVar84);
  auVar281 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar194 = vmovshdup_avx(local_3a0);
  auVar179 = vmovsldup_avx(local_3a0);
  auVar340._0_4_ = fVar149 * auVar179._0_4_ + fVar187 * auVar194._0_4_ + fVar210 * auVar281._0_4_;
  auVar340._4_4_ = fVar184 * auVar179._4_4_ + fVar207 * auVar194._4_4_ + fVar234 * auVar281._4_4_;
  auVar340._8_4_ = fVar185 * auVar179._8_4_ + fVar208 * auVar194._8_4_ + fVar235 * auVar281._8_4_;
  auVar340._12_4_ =
       fVar186 * auVar179._12_4_ + fVar209 * auVar194._12_4_ + fVar236 * auVar281._12_4_;
  local_3b0 = vsubps_avx(_local_4e0,auVar84);
  auVar281 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar194 = vmovshdup_avx(local_3b0);
  auVar179 = vmovsldup_avx(local_3b0);
  auVar125._0_4_ = auVar179._0_4_ * fVar149 + auVar194._0_4_ * fVar187 + fVar210 * auVar281._0_4_;
  auVar125._4_4_ = auVar179._4_4_ * fVar184 + auVar194._4_4_ * fVar207 + fVar234 * auVar281._4_4_;
  auVar125._8_4_ = auVar179._8_4_ * fVar185 + auVar194._8_4_ * fVar208 + fVar235 * auVar281._8_4_;
  auVar125._12_4_ =
       auVar179._12_4_ * fVar186 + auVar194._12_4_ * fVar209 + fVar236 * auVar281._12_4_;
  local_3c0 = vsubps_avx(_local_4f0,auVar84);
  auVar281 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar194 = vmovshdup_avx(local_3c0);
  auVar179 = vmovsldup_avx(local_3c0);
  auVar285._0_4_ = auVar179._0_4_ * fVar149 + auVar194._0_4_ * fVar187 + auVar281._0_4_ * fVar210;
  auVar285._4_4_ = auVar179._4_4_ * fVar184 + auVar194._4_4_ * fVar207 + auVar281._4_4_ * fVar234;
  auVar285._8_4_ = auVar179._8_4_ * fVar185 + auVar194._8_4_ * fVar208 + auVar281._8_4_ * fVar235;
  auVar285._12_4_ =
       auVar179._12_4_ * fVar186 + auVar194._12_4_ * fVar209 + auVar281._12_4_ * fVar236;
  auVar57._4_4_ = fVar150;
  auVar57._0_4_ = fVar251;
  auVar57._8_4_ = fVar323;
  auVar57._12_4_ = fVar311;
  local_3d0 = vsubps_avx(auVar57,auVar84);
  auVar281 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar194 = vmovshdup_avx(local_3d0);
  auVar179 = vmovsldup_avx(local_3d0);
  auVar293._0_4_ = auVar179._0_4_ * fVar149 + auVar194._0_4_ * fVar187 + auVar281._0_4_ * fVar210;
  auVar293._4_4_ = auVar179._4_4_ * fVar184 + auVar194._4_4_ * fVar207 + auVar281._4_4_ * fVar234;
  auVar293._8_4_ = auVar179._8_4_ * fVar185 + auVar194._8_4_ * fVar208 + auVar281._8_4_ * fVar235;
  auVar293._12_4_ =
       auVar179._12_4_ * fVar186 + auVar194._12_4_ * fVar209 + auVar281._12_4_ * fVar236;
  auVar55._4_4_ = fVar314;
  auVar55._0_4_ = fVar252;
  auVar55._8_4_ = fVar324;
  auVar55._12_4_ = fVar312;
  local_3e0 = vsubps_avx(auVar55,auVar84);
  auVar281 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar194 = vmovshdup_avx(local_3e0);
  auVar179 = vmovsldup_avx(local_3e0);
  auVar307._0_4_ = auVar179._0_4_ * fVar149 + auVar194._0_4_ * fVar187 + auVar281._0_4_ * fVar210;
  auVar307._4_4_ = auVar179._4_4_ * fVar184 + auVar194._4_4_ * fVar207 + auVar281._4_4_ * fVar234;
  auVar307._8_4_ = auVar179._8_4_ * fVar185 + auVar194._8_4_ * fVar208 + auVar281._8_4_ * fVar235;
  auVar307._12_4_ =
       auVar179._12_4_ * fVar186 + auVar194._12_4_ * fVar209 + auVar281._12_4_ * fVar236;
  auVar61._4_4_ = fStack_4fc;
  auVar61._0_4_ = local_500;
  auVar61._8_4_ = fStack_4f8;
  auVar61._12_4_ = fStack_4f4;
  local_3f0 = vsubps_avx(auVar61,auVar84);
  auVar179 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar84 = vmovshdup_avx(local_3f0);
  auVar194 = vmovsldup_avx(local_3f0);
  auVar90._0_4_ = fVar149 * auVar194._0_4_ + fVar187 * auVar84._0_4_ + fVar210 * auVar179._0_4_;
  auVar90._4_4_ = fVar184 * auVar194._4_4_ + fVar207 * auVar84._4_4_ + fVar234 * auVar179._4_4_;
  auVar90._8_4_ = fVar185 * auVar194._8_4_ + fVar208 * auVar84._8_4_ + fVar235 * auVar179._8_4_;
  auVar90._12_4_ = fVar186 * auVar194._12_4_ + fVar209 * auVar84._12_4_ + fVar236 * auVar179._12_4_;
  auVar281 = vmovlhps_avx(_local_6f0,auVar285);
  auVar15 = vmovlhps_avx(auVar350,auVar293);
  auVar163 = vmovlhps_avx(auVar340,auVar307);
  _local_4a0 = vmovlhps_avx(auVar125,auVar90);
  auVar84 = vminps_avx(auVar281,auVar15);
  auVar194 = vminps_avx(auVar163,_local_4a0);
  auVar179 = vminps_avx(auVar84,auVar194);
  auVar84 = vmaxps_avx(auVar281,auVar15);
  auVar194 = vmaxps_avx(auVar163,_local_4a0);
  auVar84 = vmaxps_avx(auVar84,auVar194);
  auVar194 = vshufpd_avx(auVar179,auVar179,3);
  auVar179 = vminps_avx(auVar179,auVar194);
  auVar194 = vshufpd_avx(auVar84,auVar84,3);
  auVar194 = vmaxps_avx(auVar84,auVar194);
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  auVar84 = vandps_avx(auVar179,auVar261);
  auVar194 = vandps_avx(auVar194,auVar261);
  auVar84 = vmaxps_avx(auVar84,auVar194);
  auVar194 = vmovshdup_avx(auVar84);
  auVar84 = vmaxss_avx(auVar194,auVar84);
  local_528 = uVar62 + 0xf;
  fVar149 = auVar84._0_4_ * 9.536743e-07;
  local_4b0 = ZEXT416((uint)fVar149);
  auVar84 = vshufps_avx(local_4b0,ZEXT416((uint)fVar149),0);
  local_1c0._16_16_ = auVar84;
  local_1c0._0_16_ = auVar84;
  auVar91._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
  auVar91._8_4_ = auVar84._8_4_ ^ 0x80000000;
  auVar91._12_4_ = auVar84._12_4_ ^ 0x80000000;
  local_340._16_16_ = auVar91;
  local_340._0_16_ = auVar91;
  auVar84 = vpshufd_avx(ZEXT416(uVar66),0);
  local_2e0._16_16_ = auVar84;
  local_2e0._0_16_ = auVar84;
  auVar84 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar68 * 4 + 6)),0);
  local_300._16_16_ = auVar84;
  local_300._0_16_ = auVar84;
  bVar72 = false;
  uVar71 = 0;
  fVar149 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar15,auVar281);
  _local_360 = vsubps_avx(auVar163,auVar15);
  _local_370 = vsubps_avx(_local_4a0,auVar163);
  _local_420 = vsubps_avx(_local_4f0,_local_4c0);
  auVar58._4_4_ = fVar150;
  auVar58._0_4_ = fVar251;
  auVar58._8_4_ = fVar323;
  auVar58._12_4_ = fVar311;
  auVar60._4_4_ = fVar253;
  auVar60._0_4_ = fVar237;
  auVar60._8_4_ = fVar322;
  auVar60._12_4_ = fVar304;
  _local_430 = vsubps_avx(auVar58,auVar60);
  auVar56._4_4_ = fVar314;
  auVar56._0_4_ = fVar252;
  auVar56._8_4_ = fVar324;
  auVar56._12_4_ = fVar312;
  _local_440 = vsubps_avx(auVar56,_local_4d0);
  _local_450 = vsubps_avx(auVar61,_local_4e0);
  auVar92 = ZEXT816(0x3f80000000000000);
  local_400 = auVar92;
LAB_00f8db4c:
  do {
    auVar84 = vshufps_avx(auVar92,auVar92,0x50);
    auVar351._8_4_ = 0x3f800000;
    auVar351._0_8_ = 0x3f8000003f800000;
    auVar351._12_4_ = 0x3f800000;
    auVar355._16_4_ = 0x3f800000;
    auVar355._0_16_ = auVar351;
    auVar355._20_4_ = 0x3f800000;
    auVar355._24_4_ = 0x3f800000;
    auVar355._28_4_ = 0x3f800000;
    auVar194 = vsubps_avx(auVar351,auVar84);
    fVar184 = auVar84._0_4_;
    fVar185 = auVar84._4_4_;
    fVar186 = auVar84._8_4_;
    fVar187 = auVar84._12_4_;
    fVar207 = auVar194._0_4_;
    fVar208 = auVar194._4_4_;
    fVar209 = auVar194._8_4_;
    fVar210 = auVar194._12_4_;
    auVar203._0_4_ = auVar285._0_4_ * fVar184 + fVar207 * (float)local_6f0._0_4_;
    auVar203._4_4_ = auVar285._4_4_ * fVar185 + fVar208 * (float)local_6f0._4_4_;
    auVar203._8_4_ = auVar285._0_4_ * fVar186 + fVar209 * (float)local_6f0._0_4_;
    auVar203._12_4_ = auVar285._4_4_ * fVar187 + fVar210 * (float)local_6f0._4_4_;
    auVar165._0_4_ = auVar293._0_4_ * fVar184 + fVar207 * auVar350._0_4_;
    auVar165._4_4_ = auVar293._4_4_ * fVar185 + fVar208 * auVar350._4_4_;
    auVar165._8_4_ = auVar293._0_4_ * fVar186 + fVar209 * auVar350._0_4_;
    auVar165._12_4_ = auVar293._4_4_ * fVar187 + fVar210 * auVar350._4_4_;
    auVar273._0_4_ = auVar307._0_4_ * fVar184 + auVar340._0_4_ * fVar207;
    auVar273._4_4_ = auVar307._4_4_ * fVar185 + auVar340._4_4_ * fVar208;
    auVar273._8_4_ = auVar307._0_4_ * fVar186 + auVar340._0_4_ * fVar209;
    auVar273._12_4_ = auVar307._4_4_ * fVar187 + auVar340._4_4_ * fVar210;
    auVar220._0_4_ = auVar90._0_4_ * fVar184 + auVar125._0_4_ * fVar207;
    auVar220._4_4_ = auVar90._4_4_ * fVar185 + auVar125._4_4_ * fVar208;
    auVar220._8_4_ = auVar90._0_4_ * fVar186 + auVar125._0_4_ * fVar209;
    auVar220._12_4_ = auVar90._4_4_ * fVar187 + auVar125._4_4_ * fVar210;
    auVar84 = vmovshdup_avx(local_400);
    auVar194 = vshufps_avx(local_400,local_400,0);
    auVar299._16_16_ = auVar194;
    auVar299._0_16_ = auVar194;
    auVar179 = vshufps_avx(local_400,local_400,0x55);
    auVar108._16_16_ = auVar179;
    auVar108._0_16_ = auVar179;
    auVar107 = vsubps_avx(auVar108,auVar299);
    auVar179 = vshufps_avx(auVar203,auVar203,0);
    auVar139 = vshufps_avx(auVar203,auVar203,0x55);
    auVar128 = vshufps_avx(auVar165,auVar165,0);
    auVar169 = vshufps_avx(auVar165,auVar165,0x55);
    auVar129 = vshufps_avx(auVar273,auVar273,0);
    auVar83 = vshufps_avx(auVar273,auVar273,0x55);
    auVar272 = vshufps_avx(auVar220,auVar220,0);
    auVar73 = vshufps_avx(auVar220,auVar220,0x55);
    auVar84 = ZEXT416((uint)((auVar84._0_4_ - local_400._0_4_) * 0.04761905));
    auVar84 = vshufps_avx(auVar84,auVar84,0);
    auVar310._0_4_ = auVar194._0_4_ + auVar107._0_4_ * 0.0;
    auVar310._4_4_ = auVar194._4_4_ + auVar107._4_4_ * 0.14285715;
    auVar310._8_4_ = auVar194._8_4_ + auVar107._8_4_ * 0.2857143;
    auVar310._12_4_ = auVar194._12_4_ + auVar107._12_4_ * 0.42857146;
    auVar310._16_4_ = auVar194._0_4_ + auVar107._16_4_ * 0.5714286;
    auVar310._20_4_ = auVar194._4_4_ + auVar107._20_4_ * 0.71428573;
    auVar310._24_4_ = auVar194._8_4_ + auVar107._24_4_ * 0.8571429;
    auVar310._28_4_ = auVar194._12_4_ + auVar107._28_4_;
    auVar16 = vsubps_avx(auVar355,auVar310);
    fVar184 = auVar128._0_4_;
    fVar186 = auVar128._4_4_;
    fVar207 = auVar128._8_4_;
    fVar209 = auVar128._12_4_;
    fVar360 = auVar16._0_4_;
    fVar363 = auVar16._4_4_;
    fVar365 = auVar16._8_4_;
    fVar368 = auVar16._12_4_;
    fVar301 = auVar16._16_4_;
    fVar302 = auVar16._20_4_;
    fVar303 = auVar16._24_4_;
    fVar347 = auVar169._0_4_;
    fVar357 = auVar169._4_4_;
    fVar359 = auVar169._8_4_;
    fVar364 = auVar169._12_4_;
    fVar346 = auVar139._12_4_ + 1.0;
    fVar337 = auVar129._0_4_;
    fVar343 = auVar129._4_4_;
    fVar344 = auVar129._8_4_;
    fVar345 = auVar129._12_4_;
    fVar234 = fVar337 * auVar310._0_4_ + fVar360 * fVar184;
    fVar235 = fVar343 * auVar310._4_4_ + fVar363 * fVar186;
    fVar236 = fVar344 * auVar310._8_4_ + fVar365 * fVar207;
    fVar313 = fVar345 * auVar310._12_4_ + fVar368 * fVar209;
    fVar325 = fVar337 * auVar310._16_4_ + fVar301 * fVar184;
    fVar330 = fVar343 * auVar310._20_4_ + fVar302 * fVar186;
    fVar331 = fVar344 * auVar310._24_4_ + fVar303 * fVar207;
    fVar185 = auVar83._0_4_;
    fVar187 = auVar83._4_4_;
    fVar208 = auVar83._8_4_;
    fVar210 = auVar83._12_4_;
    fVar356 = fVar347 * fVar360 + auVar310._0_4_ * fVar185;
    fVar358 = fVar357 * fVar363 + auVar310._4_4_ * fVar187;
    fVar362 = fVar359 * fVar365 + auVar310._8_4_ * fVar208;
    fVar367 = fVar364 * fVar368 + auVar310._12_4_ * fVar210;
    fVar333 = fVar347 * fVar301 + auVar310._16_4_ * fVar185;
    fVar334 = fVar357 * fVar302 + auVar310._20_4_ * fVar187;
    fVar335 = fVar359 * fVar303 + auVar310._24_4_ * fVar208;
    fVar336 = fVar364 + fVar209;
    auVar194 = vshufps_avx(auVar203,auVar203,0xaa);
    auVar128 = vshufps_avx(auVar203,auVar203,0xff);
    fVar332 = fVar345 + 0.0;
    auVar169 = vshufps_avx(auVar165,auVar165,0xaa);
    auVar129 = vshufps_avx(auVar165,auVar165,0xff);
    auVar232._0_4_ =
         fVar360 * (auVar310._0_4_ * fVar184 + fVar360 * auVar179._0_4_) + auVar310._0_4_ * fVar234;
    auVar232._4_4_ =
         fVar363 * (auVar310._4_4_ * fVar186 + fVar363 * auVar179._4_4_) + auVar310._4_4_ * fVar235;
    auVar232._8_4_ =
         fVar365 * (auVar310._8_4_ * fVar207 + fVar365 * auVar179._8_4_) + auVar310._8_4_ * fVar236;
    auVar232._12_4_ =
         fVar368 * (auVar310._12_4_ * fVar209 + fVar368 * auVar179._12_4_) +
         auVar310._12_4_ * fVar313;
    auVar232._16_4_ =
         fVar301 * (auVar310._16_4_ * fVar184 + fVar301 * auVar179._0_4_) +
         auVar310._16_4_ * fVar325;
    auVar232._20_4_ =
         fVar302 * (auVar310._20_4_ * fVar186 + fVar302 * auVar179._4_4_) +
         auVar310._20_4_ * fVar330;
    auVar232._24_4_ =
         fVar303 * (auVar310._24_4_ * fVar207 + fVar303 * auVar179._8_4_) +
         auVar310._24_4_ * fVar331;
    auVar232._28_4_ = auVar179._12_4_ + 1.0 + fVar210;
    auVar249._0_4_ =
         fVar360 * (fVar347 * auVar310._0_4_ + auVar139._0_4_ * fVar360) + auVar310._0_4_ * fVar356;
    auVar249._4_4_ =
         fVar363 * (fVar357 * auVar310._4_4_ + auVar139._4_4_ * fVar363) + auVar310._4_4_ * fVar358;
    auVar249._8_4_ =
         fVar365 * (fVar359 * auVar310._8_4_ + auVar139._8_4_ * fVar365) + auVar310._8_4_ * fVar362;
    auVar249._12_4_ =
         fVar368 * (fVar364 * auVar310._12_4_ + auVar139._12_4_ * fVar368) +
         auVar310._12_4_ * fVar367;
    auVar249._16_4_ =
         fVar301 * (fVar347 * auVar310._16_4_ + auVar139._0_4_ * fVar301) +
         auVar310._16_4_ * fVar333;
    auVar249._20_4_ =
         fVar302 * (fVar357 * auVar310._20_4_ + auVar139._4_4_ * fVar302) +
         auVar310._20_4_ * fVar334;
    auVar249._24_4_ =
         fVar303 * (fVar359 * auVar310._24_4_ + auVar139._8_4_ * fVar303) +
         auVar310._24_4_ * fVar335;
    auVar249._28_4_ = auVar73._12_4_ + fVar210;
    auVar109._0_4_ =
         fVar360 * fVar234 + auVar310._0_4_ * (fVar337 * fVar360 + auVar272._0_4_ * auVar310._0_4_);
    auVar109._4_4_ =
         fVar363 * fVar235 + auVar310._4_4_ * (fVar343 * fVar363 + auVar272._4_4_ * auVar310._4_4_);
    auVar109._8_4_ =
         fVar365 * fVar236 + auVar310._8_4_ * (fVar344 * fVar365 + auVar272._8_4_ * auVar310._8_4_);
    auVar109._12_4_ =
         fVar368 * fVar313 +
         auVar310._12_4_ * (fVar345 * fVar368 + auVar272._12_4_ * auVar310._12_4_);
    auVar109._16_4_ =
         fVar301 * fVar325 +
         auVar310._16_4_ * (fVar337 * fVar301 + auVar272._0_4_ * auVar310._16_4_);
    auVar109._20_4_ =
         fVar302 * fVar330 +
         auVar310._20_4_ * (fVar343 * fVar302 + auVar272._4_4_ * auVar310._20_4_);
    auVar109._24_4_ =
         fVar303 * fVar331 +
         auVar310._24_4_ * (fVar344 * fVar303 + auVar272._8_4_ * auVar310._24_4_);
    auVar109._28_4_ = fVar209 + 1.0 + fVar332;
    auVar321._0_4_ =
         fVar360 * fVar356 + auVar310._0_4_ * (auVar73._0_4_ * auVar310._0_4_ + fVar360 * fVar185);
    auVar321._4_4_ =
         fVar363 * fVar358 + auVar310._4_4_ * (auVar73._4_4_ * auVar310._4_4_ + fVar363 * fVar187);
    auVar321._8_4_ =
         fVar365 * fVar362 + auVar310._8_4_ * (auVar73._8_4_ * auVar310._8_4_ + fVar365 * fVar208);
    auVar321._12_4_ =
         fVar368 * fVar367 +
         auVar310._12_4_ * (auVar73._12_4_ * auVar310._12_4_ + fVar368 * fVar210);
    auVar321._16_4_ =
         fVar301 * fVar333 + auVar310._16_4_ * (auVar73._0_4_ * auVar310._16_4_ + fVar301 * fVar185)
    ;
    auVar321._20_4_ =
         fVar302 * fVar334 + auVar310._20_4_ * (auVar73._4_4_ * auVar310._20_4_ + fVar302 * fVar187)
    ;
    auVar321._24_4_ =
         fVar303 * fVar335 + auVar310._24_4_ * (auVar73._8_4_ * auVar310._24_4_ + fVar303 * fVar208)
    ;
    auVar321._28_4_ = fVar332 + fVar210 + 0.0;
    local_200._0_4_ = fVar360 * auVar232._0_4_ + auVar310._0_4_ * auVar109._0_4_;
    local_200._4_4_ = fVar363 * auVar232._4_4_ + auVar310._4_4_ * auVar109._4_4_;
    local_200._8_4_ = fVar365 * auVar232._8_4_ + auVar310._8_4_ * auVar109._8_4_;
    local_200._12_4_ = fVar368 * auVar232._12_4_ + auVar310._12_4_ * auVar109._12_4_;
    local_200._16_4_ = fVar301 * auVar232._16_4_ + auVar310._16_4_ * auVar109._16_4_;
    local_200._20_4_ = fVar302 * auVar232._20_4_ + auVar310._20_4_ * auVar109._20_4_;
    local_200._24_4_ = fVar303 * auVar232._24_4_ + auVar310._24_4_ * auVar109._24_4_;
    local_200._28_4_ = fVar336 + fVar210 + 0.0;
    auVar206._0_4_ = fVar360 * auVar249._0_4_ + auVar310._0_4_ * auVar321._0_4_;
    auVar206._4_4_ = fVar363 * auVar249._4_4_ + auVar310._4_4_ * auVar321._4_4_;
    auVar206._8_4_ = fVar365 * auVar249._8_4_ + auVar310._8_4_ * auVar321._8_4_;
    auVar206._12_4_ = fVar368 * auVar249._12_4_ + auVar310._12_4_ * auVar321._12_4_;
    auVar206._16_4_ = fVar301 * auVar249._16_4_ + auVar310._16_4_ * auVar321._16_4_;
    auVar206._20_4_ = fVar302 * auVar249._20_4_ + auVar310._20_4_ * auVar321._20_4_;
    auVar206._24_4_ = fVar303 * auVar249._24_4_ + auVar310._24_4_ * auVar321._24_4_;
    auVar206._28_4_ = fVar336 + fVar332;
    auVar17 = vsubps_avx(auVar109,auVar232);
    auVar107 = vsubps_avx(auVar321,auVar249);
    local_600 = auVar84._0_4_;
    fStack_5fc = auVar84._4_4_;
    fStack_5f8 = auVar84._8_4_;
    fStack_5f4 = auVar84._12_4_;
    local_240 = local_600 * auVar17._0_4_ * 3.0;
    fStack_23c = fStack_5fc * auVar17._4_4_ * 3.0;
    auVar18._4_4_ = fStack_23c;
    auVar18._0_4_ = local_240;
    fStack_238 = fStack_5f8 * auVar17._8_4_ * 3.0;
    auVar18._8_4_ = fStack_238;
    fStack_234 = fStack_5f4 * auVar17._12_4_ * 3.0;
    auVar18._12_4_ = fStack_234;
    fStack_230 = local_600 * auVar17._16_4_ * 3.0;
    auVar18._16_4_ = fStack_230;
    fStack_22c = fStack_5fc * auVar17._20_4_ * 3.0;
    auVar18._20_4_ = fStack_22c;
    fStack_228 = fStack_5f8 * auVar17._24_4_ * 3.0;
    auVar18._24_4_ = fStack_228;
    auVar18._28_4_ = auVar17._28_4_;
    local_260 = local_600 * auVar107._0_4_ * 3.0;
    fStack_25c = fStack_5fc * auVar107._4_4_ * 3.0;
    auVar19._4_4_ = fStack_25c;
    auVar19._0_4_ = local_260;
    fStack_258 = fStack_5f8 * auVar107._8_4_ * 3.0;
    auVar19._8_4_ = fStack_258;
    fStack_254 = fStack_5f4 * auVar107._12_4_ * 3.0;
    auVar19._12_4_ = fStack_254;
    fStack_250 = local_600 * auVar107._16_4_ * 3.0;
    auVar19._16_4_ = fStack_250;
    fStack_24c = fStack_5fc * auVar107._20_4_ * 3.0;
    auVar19._20_4_ = fStack_24c;
    fStack_248 = fStack_5f8 * auVar107._24_4_ * 3.0;
    auVar19._24_4_ = fStack_248;
    auVar19._28_4_ = fVar336;
    auVar18 = vsubps_avx(local_200,auVar18);
    auVar107 = vperm2f128_avx(auVar18,auVar18,1);
    auVar107 = vshufps_avx(auVar107,auVar18,0x30);
    auVar107 = vshufps_avx(auVar18,auVar107,0x29);
    auVar19 = vsubps_avx(auVar206,auVar19);
    auVar18 = vperm2f128_avx(auVar19,auVar19,1);
    auVar18 = vshufps_avx(auVar18,auVar19,0x30);
    auVar19 = vshufps_avx(auVar19,auVar18,0x29);
    fVar334 = auVar169._0_4_;
    fVar335 = auVar169._4_4_;
    fVar366 = auVar169._8_4_;
    fVar209 = auVar194._12_4_;
    fVar343 = auVar129._0_4_;
    fVar345 = auVar129._4_4_;
    fVar356 = auVar129._8_4_;
    fVar358 = auVar129._12_4_;
    auVar84 = vshufps_avx(auVar273,auVar273,0xaa);
    fVar184 = auVar84._0_4_;
    fVar186 = auVar84._4_4_;
    fVar207 = auVar84._8_4_;
    fVar210 = auVar84._12_4_;
    fVar236 = auVar310._0_4_ * fVar184 + fVar334 * fVar360;
    fVar313 = auVar310._4_4_ * fVar186 + fVar335 * fVar363;
    fVar325 = auVar310._8_4_ * fVar207 + fVar366 * fVar365;
    fVar330 = auVar310._12_4_ * fVar210 + auVar169._12_4_ * fVar368;
    fVar331 = auVar310._16_4_ * fVar184 + fVar334 * fVar301;
    fVar332 = auVar310._20_4_ * fVar186 + fVar335 * fVar302;
    fVar337 = auVar310._24_4_ * fVar207 + fVar366 * fVar303;
    auVar84 = vshufps_avx(auVar273,auVar273,0xff);
    fVar185 = auVar84._0_4_;
    fVar187 = auVar84._4_4_;
    fVar208 = auVar84._8_4_;
    fVar234 = auVar84._12_4_;
    fVar344 = auVar310._0_4_ * fVar185 + fVar343 * fVar360;
    fVar347 = auVar310._4_4_ * fVar187 + fVar345 * fVar363;
    fVar357 = auVar310._8_4_ * fVar208 + fVar356 * fVar365;
    fVar359 = auVar310._12_4_ * fVar234 + fVar358 * fVar368;
    fVar362 = auVar310._16_4_ * fVar185 + fVar343 * fVar301;
    fVar364 = auVar310._20_4_ * fVar187 + fVar345 * fVar302;
    fVar367 = auVar310._24_4_ * fVar208 + fVar356 * fVar303;
    auVar84 = vshufps_avx(auVar220,auVar220,0xaa);
    fVar333 = auVar84._12_4_ + fVar210;
    auVar179 = vshufps_avx(auVar220,auVar220,0xff);
    fVar235 = auVar179._12_4_;
    auVar110._0_4_ =
         fVar360 * (fVar334 * auVar310._0_4_ + fVar360 * auVar194._0_4_) + auVar310._0_4_ * fVar236;
    auVar110._4_4_ =
         fVar363 * (fVar335 * auVar310._4_4_ + fVar363 * auVar194._4_4_) + auVar310._4_4_ * fVar313;
    auVar110._8_4_ =
         fVar365 * (fVar366 * auVar310._8_4_ + fVar365 * auVar194._8_4_) + auVar310._8_4_ * fVar325;
    auVar110._12_4_ =
         fVar368 * (auVar169._12_4_ * auVar310._12_4_ + fVar368 * fVar209) +
         auVar310._12_4_ * fVar330;
    auVar110._16_4_ =
         fVar301 * (fVar334 * auVar310._16_4_ + fVar301 * auVar194._0_4_) +
         auVar310._16_4_ * fVar331;
    auVar110._20_4_ =
         fVar302 * (fVar335 * auVar310._20_4_ + fVar302 * auVar194._4_4_) +
         auVar310._20_4_ * fVar332;
    auVar110._24_4_ =
         fVar303 * (fVar366 * auVar310._24_4_ + fVar303 * auVar194._8_4_) +
         auVar310._24_4_ * fVar337;
    auVar110._28_4_ = auVar19._28_4_ + fVar209 + fVar235;
    auVar144._0_4_ =
         fVar360 * (fVar343 * auVar310._0_4_ + auVar128._0_4_ * fVar360) + auVar310._0_4_ * fVar344;
    auVar144._4_4_ =
         fVar363 * (fVar345 * auVar310._4_4_ + auVar128._4_4_ * fVar363) + auVar310._4_4_ * fVar347;
    auVar144._8_4_ =
         fVar365 * (fVar356 * auVar310._8_4_ + auVar128._8_4_ * fVar365) + auVar310._8_4_ * fVar357;
    auVar144._12_4_ =
         fVar368 * (fVar358 * auVar310._12_4_ + auVar128._12_4_ * fVar368) +
         auVar310._12_4_ * fVar359;
    auVar144._16_4_ =
         fVar301 * (fVar343 * auVar310._16_4_ + auVar128._0_4_ * fVar301) +
         auVar310._16_4_ * fVar362;
    auVar144._20_4_ =
         fVar302 * (fVar345 * auVar310._20_4_ + auVar128._4_4_ * fVar302) +
         auVar310._20_4_ * fVar364;
    auVar144._24_4_ =
         fVar303 * (fVar356 * auVar310._24_4_ + auVar128._8_4_ * fVar303) +
         auVar310._24_4_ * fVar367;
    auVar144._28_4_ = fVar209 + auVar18._28_4_ + fVar235;
    auVar18 = vperm2f128_avx(local_200,local_200,1);
    auVar18 = vshufps_avx(auVar18,local_200,0x30);
    auVar108 = vshufps_avx(local_200,auVar18,0x29);
    auVar250._0_4_ =
         auVar310._0_4_ * (auVar84._0_4_ * auVar310._0_4_ + fVar360 * fVar184) + fVar360 * fVar236;
    auVar250._4_4_ =
         auVar310._4_4_ * (auVar84._4_4_ * auVar310._4_4_ + fVar363 * fVar186) + fVar363 * fVar313;
    auVar250._8_4_ =
         auVar310._8_4_ * (auVar84._8_4_ * auVar310._8_4_ + fVar365 * fVar207) + fVar365 * fVar325;
    auVar250._12_4_ =
         auVar310._12_4_ * (auVar84._12_4_ * auVar310._12_4_ + fVar368 * fVar210) +
         fVar368 * fVar330;
    auVar250._16_4_ =
         auVar310._16_4_ * (auVar84._0_4_ * auVar310._16_4_ + fVar301 * fVar184) + fVar301 * fVar331
    ;
    auVar250._20_4_ =
         auVar310._20_4_ * (auVar84._4_4_ * auVar310._20_4_ + fVar302 * fVar186) + fVar302 * fVar332
    ;
    auVar250._24_4_ =
         auVar310._24_4_ * (auVar84._8_4_ * auVar310._24_4_ + fVar303 * fVar207) + fVar303 * fVar337
    ;
    auVar250._28_4_ = fVar333 + fVar346 + auVar249._28_4_;
    auVar290._0_4_ =
         fVar360 * fVar344 + auVar310._0_4_ * (auVar310._0_4_ * auVar179._0_4_ + fVar360 * fVar185);
    auVar290._4_4_ =
         fVar363 * fVar347 + auVar310._4_4_ * (auVar310._4_4_ * auVar179._4_4_ + fVar363 * fVar187);
    auVar290._8_4_ =
         fVar365 * fVar357 + auVar310._8_4_ * (auVar310._8_4_ * auVar179._8_4_ + fVar365 * fVar208);
    auVar290._12_4_ =
         fVar368 * fVar359 + auVar310._12_4_ * (auVar310._12_4_ * fVar235 + fVar368 * fVar234);
    auVar290._16_4_ =
         fVar301 * fVar362 +
         auVar310._16_4_ * (auVar310._16_4_ * auVar179._0_4_ + fVar301 * fVar185);
    auVar290._20_4_ =
         fVar302 * fVar364 +
         auVar310._20_4_ * (auVar310._20_4_ * auVar179._4_4_ + fVar302 * fVar187);
    auVar290._24_4_ =
         fVar303 * fVar367 +
         auVar310._24_4_ * (auVar310._24_4_ * auVar179._8_4_ + fVar303 * fVar208);
    auVar290._28_4_ = fVar346 + fVar358 + fVar235 + fVar234;
    auVar275._0_4_ = fVar360 * auVar110._0_4_ + auVar310._0_4_ * auVar250._0_4_;
    auVar275._4_4_ = fVar363 * auVar110._4_4_ + auVar310._4_4_ * auVar250._4_4_;
    auVar275._8_4_ = fVar365 * auVar110._8_4_ + auVar310._8_4_ * auVar250._8_4_;
    auVar275._12_4_ = fVar368 * auVar110._12_4_ + auVar310._12_4_ * auVar250._12_4_;
    auVar275._16_4_ = fVar301 * auVar110._16_4_ + auVar310._16_4_ * auVar250._16_4_;
    auVar275._20_4_ = fVar302 * auVar110._20_4_ + auVar310._20_4_ * auVar250._20_4_;
    auVar275._24_4_ = fVar303 * auVar110._24_4_ + auVar310._24_4_ * auVar250._24_4_;
    auVar275._28_4_ = fVar333 + fVar235 + fVar234;
    auVar300._0_4_ = fVar360 * auVar144._0_4_ + auVar310._0_4_ * auVar290._0_4_;
    auVar300._4_4_ = fVar363 * auVar144._4_4_ + auVar310._4_4_ * auVar290._4_4_;
    auVar300._8_4_ = fVar365 * auVar144._8_4_ + auVar310._8_4_ * auVar290._8_4_;
    auVar300._12_4_ = fVar368 * auVar144._12_4_ + auVar310._12_4_ * auVar290._12_4_;
    auVar300._16_4_ = fVar301 * auVar144._16_4_ + auVar310._16_4_ * auVar290._16_4_;
    auVar300._20_4_ = fVar302 * auVar144._20_4_ + auVar310._20_4_ * auVar290._20_4_;
    auVar300._24_4_ = fVar303 * auVar144._24_4_ + auVar310._24_4_ * auVar290._24_4_;
    auVar300._28_4_ = auVar16._28_4_ + auVar310._28_4_;
    auVar20 = vsubps_avx(auVar250,auVar110);
    auVar18 = vsubps_avx(auVar290,auVar144);
    local_280 = local_600 * auVar20._0_4_ * 3.0;
    fStack_27c = fStack_5fc * auVar20._4_4_ * 3.0;
    auVar16._4_4_ = fStack_27c;
    auVar16._0_4_ = local_280;
    fStack_278 = fStack_5f8 * auVar20._8_4_ * 3.0;
    auVar16._8_4_ = fStack_278;
    fStack_274 = fStack_5f4 * auVar20._12_4_ * 3.0;
    auVar16._12_4_ = fStack_274;
    fStack_270 = local_600 * auVar20._16_4_ * 3.0;
    auVar16._16_4_ = fStack_270;
    fStack_26c = fStack_5fc * auVar20._20_4_ * 3.0;
    auVar16._20_4_ = fStack_26c;
    fStack_268 = fStack_5f8 * auVar20._24_4_ * 3.0;
    auVar16._24_4_ = fStack_268;
    auVar16._28_4_ = auVar20._28_4_;
    local_2a0 = local_600 * auVar18._0_4_ * 3.0;
    fStack_29c = fStack_5fc * auVar18._4_4_ * 3.0;
    auVar21._4_4_ = fStack_29c;
    auVar21._0_4_ = local_2a0;
    fStack_298 = fStack_5f8 * auVar18._8_4_ * 3.0;
    auVar21._8_4_ = fStack_298;
    fStack_294 = fStack_5f4 * auVar18._12_4_ * 3.0;
    auVar21._12_4_ = fStack_294;
    fStack_290 = local_600 * auVar18._16_4_ * 3.0;
    auVar21._16_4_ = fStack_290;
    fStack_28c = fStack_5fc * auVar18._20_4_ * 3.0;
    auVar21._20_4_ = fStack_28c;
    fStack_288 = fStack_5f8 * auVar18._24_4_ * 3.0;
    auVar21._24_4_ = fStack_288;
    auVar21._28_4_ = auVar250._28_4_;
    auVar18 = vperm2f128_avx(auVar275,auVar275,1);
    auVar18 = vshufps_avx(auVar18,auVar275,0x30);
    auVar109 = vshufps_avx(auVar275,auVar18,0x29);
    auVar16 = vsubps_avx(auVar275,auVar16);
    auVar18 = vperm2f128_avx(auVar16,auVar16,1);
    auVar18 = vshufps_avx(auVar18,auVar16,0x30);
    auVar18 = vshufps_avx(auVar16,auVar18,0x29);
    auVar21 = vsubps_avx(auVar300,auVar21);
    auVar16 = vperm2f128_avx(auVar21,auVar21,1);
    auVar16 = vshufps_avx(auVar16,auVar21,0x30);
    auVar21 = vshufps_avx(auVar21,auVar16,0x29);
    auVar22 = vsubps_avx(auVar275,local_200);
    auVar110 = vsubps_avx(auVar109,auVar108);
    fVar184 = auVar110._0_4_ + auVar22._0_4_;
    fVar185 = auVar110._4_4_ + auVar22._4_4_;
    fVar186 = auVar110._8_4_ + auVar22._8_4_;
    fVar187 = auVar110._12_4_ + auVar22._12_4_;
    fVar207 = auVar110._16_4_ + auVar22._16_4_;
    fVar208 = auVar110._20_4_ + auVar22._20_4_;
    fVar209 = auVar110._24_4_ + auVar22._24_4_;
    auVar16 = vperm2f128_avx(auVar206,auVar206,1);
    auVar16 = vshufps_avx(auVar16,auVar206,0x30);
    local_220 = vshufps_avx(auVar206,auVar16,0x29);
    auVar16 = vperm2f128_avx(auVar300,auVar300,1);
    auVar16 = vshufps_avx(auVar16,auVar300,0x30);
    local_1e0 = vshufps_avx(auVar300,auVar16,0x29);
    auVar16 = vsubps_avx(auVar300,auVar206);
    auVar144 = vsubps_avx(local_1e0,local_220);
    fVar210 = auVar144._0_4_ + auVar16._0_4_;
    fVar234 = auVar144._4_4_ + auVar16._4_4_;
    fVar235 = auVar144._8_4_ + auVar16._8_4_;
    fVar236 = auVar144._12_4_ + auVar16._12_4_;
    fVar313 = auVar144._16_4_ + auVar16._16_4_;
    fVar325 = auVar144._20_4_ + auVar16._20_4_;
    fVar330 = auVar144._24_4_ + auVar16._24_4_;
    auVar23._4_4_ = fVar185 * auVar206._4_4_;
    auVar23._0_4_ = fVar184 * auVar206._0_4_;
    auVar23._8_4_ = fVar186 * auVar206._8_4_;
    auVar23._12_4_ = fVar187 * auVar206._12_4_;
    auVar23._16_4_ = fVar207 * auVar206._16_4_;
    auVar23._20_4_ = fVar208 * auVar206._20_4_;
    auVar23._24_4_ = fVar209 * auVar206._24_4_;
    auVar23._28_4_ = auVar16._28_4_;
    auVar24._4_4_ = fVar234 * local_200._4_4_;
    auVar24._0_4_ = fVar210 * local_200._0_4_;
    auVar24._8_4_ = fVar235 * local_200._8_4_;
    auVar24._12_4_ = fVar236 * local_200._12_4_;
    auVar24._16_4_ = fVar313 * local_200._16_4_;
    auVar24._20_4_ = fVar325 * local_200._20_4_;
    auVar24._24_4_ = fVar330 * local_200._24_4_;
    auVar24._28_4_ = fVar333;
    auVar23 = vsubps_avx(auVar23,auVar24);
    local_240 = local_200._0_4_ + local_240;
    fStack_23c = local_200._4_4_ + fStack_23c;
    fStack_238 = local_200._8_4_ + fStack_238;
    fStack_234 = local_200._12_4_ + fStack_234;
    fStack_230 = local_200._16_4_ + fStack_230;
    fStack_22c = local_200._20_4_ + fStack_22c;
    fStack_228 = local_200._24_4_ + fStack_228;
    fStack_224 = local_200._28_4_ + auVar17._28_4_;
    local_260 = local_260 + auVar206._0_4_;
    fStack_25c = fStack_25c + auVar206._4_4_;
    fStack_258 = fStack_258 + auVar206._8_4_;
    fStack_254 = fStack_254 + auVar206._12_4_;
    fStack_250 = fStack_250 + auVar206._16_4_;
    fStack_24c = fStack_24c + auVar206._20_4_;
    fStack_248 = fStack_248 + auVar206._24_4_;
    fStack_244 = fVar336 + auVar206._28_4_;
    auVar17._4_4_ = fVar185 * fStack_25c;
    auVar17._0_4_ = fVar184 * local_260;
    auVar17._8_4_ = fVar186 * fStack_258;
    auVar17._12_4_ = fVar187 * fStack_254;
    auVar17._16_4_ = fVar207 * fStack_250;
    auVar17._20_4_ = fVar208 * fStack_24c;
    auVar17._24_4_ = fVar209 * fStack_248;
    auVar17._28_4_ = fVar336;
    auVar25._4_4_ = fVar234 * fStack_23c;
    auVar25._0_4_ = fVar210 * local_240;
    auVar25._8_4_ = fVar235 * fStack_238;
    auVar25._12_4_ = fVar236 * fStack_234;
    auVar25._16_4_ = fVar313 * fStack_230;
    auVar25._20_4_ = fVar325 * fStack_22c;
    auVar25._24_4_ = fVar330 * fStack_228;
    auVar25._28_4_ = fVar336 + auVar206._28_4_;
    auVar17 = vsubps_avx(auVar17,auVar25);
    local_6c0 = auVar19._0_4_;
    fStack_6bc = auVar19._4_4_;
    fStack_6b8 = auVar19._8_4_;
    fStack_6b4 = auVar19._12_4_;
    fStack_6b0 = auVar19._16_4_;
    fStack_6ac = auVar19._20_4_;
    fStack_6a8 = auVar19._24_4_;
    auVar26._4_4_ = fVar185 * fStack_6bc;
    auVar26._0_4_ = fVar184 * local_6c0;
    auVar26._8_4_ = fVar186 * fStack_6b8;
    auVar26._12_4_ = fVar187 * fStack_6b4;
    auVar26._16_4_ = fVar207 * fStack_6b0;
    auVar26._20_4_ = fVar208 * fStack_6ac;
    auVar26._24_4_ = fVar209 * fStack_6a8;
    auVar26._28_4_ = fVar336;
    local_6a0 = auVar107._0_4_;
    fStack_69c = auVar107._4_4_;
    fStack_698 = auVar107._8_4_;
    fStack_694 = auVar107._12_4_;
    fStack_690 = auVar107._16_4_;
    fStack_68c = auVar107._20_4_;
    fStack_688 = auVar107._24_4_;
    auVar27._4_4_ = fVar234 * fStack_69c;
    auVar27._0_4_ = fVar210 * local_6a0;
    auVar27._8_4_ = fVar235 * fStack_698;
    auVar27._12_4_ = fVar236 * fStack_694;
    auVar27._16_4_ = fVar313 * fStack_690;
    auVar27._20_4_ = fVar325 * fStack_68c;
    auVar27._24_4_ = fVar330 * fStack_688;
    auVar27._28_4_ = local_200._28_4_;
    auVar24 = vsubps_avx(auVar26,auVar27);
    auVar28._4_4_ = local_220._4_4_ * fVar185;
    auVar28._0_4_ = local_220._0_4_ * fVar184;
    auVar28._8_4_ = local_220._8_4_ * fVar186;
    auVar28._12_4_ = local_220._12_4_ * fVar187;
    auVar28._16_4_ = local_220._16_4_ * fVar207;
    auVar28._20_4_ = local_220._20_4_ * fVar208;
    auVar28._24_4_ = local_220._24_4_ * fVar209;
    auVar28._28_4_ = fVar336;
    auVar29._4_4_ = auVar108._4_4_ * fVar234;
    auVar29._0_4_ = auVar108._0_4_ * fVar210;
    auVar29._8_4_ = auVar108._8_4_ * fVar235;
    auVar29._12_4_ = auVar108._12_4_ * fVar236;
    auVar29._16_4_ = auVar108._16_4_ * fVar313;
    auVar29._20_4_ = auVar108._20_4_ * fVar325;
    auVar29._24_4_ = auVar108._24_4_ * fVar330;
    auVar29._28_4_ = local_220._28_4_;
    local_600 = auVar18._0_4_;
    fStack_5fc = auVar18._4_4_;
    fStack_5f8 = auVar18._8_4_;
    fStack_5f4 = auVar18._12_4_;
    fStack_5f0 = auVar18._16_4_;
    fStack_5ec = auVar18._20_4_;
    fStack_5e8 = auVar18._24_4_;
    auVar25 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = auVar300._4_4_ * fVar185;
    auVar30._0_4_ = auVar300._0_4_ * fVar184;
    auVar30._8_4_ = auVar300._8_4_ * fVar186;
    auVar30._12_4_ = auVar300._12_4_ * fVar187;
    auVar30._16_4_ = auVar300._16_4_ * fVar207;
    auVar30._20_4_ = auVar300._20_4_ * fVar208;
    auVar30._24_4_ = auVar300._24_4_ * fVar209;
    auVar30._28_4_ = fVar336;
    auVar31._4_4_ = fVar234 * auVar275._4_4_;
    auVar31._0_4_ = fVar210 * auVar275._0_4_;
    auVar31._8_4_ = fVar235 * auVar275._8_4_;
    auVar31._12_4_ = fVar236 * auVar275._12_4_;
    auVar31._16_4_ = fVar313 * auVar275._16_4_;
    auVar31._20_4_ = fVar325 * auVar275._20_4_;
    auVar31._24_4_ = fVar330 * auVar275._24_4_;
    auVar31._28_4_ = fStack_224;
    auVar26 = vsubps_avx(auVar30,auVar31);
    local_280 = auVar275._0_4_ + local_280;
    fStack_27c = auVar275._4_4_ + fStack_27c;
    fStack_278 = auVar275._8_4_ + fStack_278;
    fStack_274 = auVar275._12_4_ + fStack_274;
    fStack_270 = auVar275._16_4_ + fStack_270;
    fStack_26c = auVar275._20_4_ + fStack_26c;
    fStack_268 = auVar275._24_4_ + fStack_268;
    fStack_264 = auVar275._28_4_ + auVar20._28_4_;
    local_2a0 = auVar300._0_4_ + local_2a0;
    fStack_29c = auVar300._4_4_ + fStack_29c;
    fStack_298 = auVar300._8_4_ + fStack_298;
    fStack_294 = auVar300._12_4_ + fStack_294;
    fStack_290 = auVar300._16_4_ + fStack_290;
    fStack_28c = auVar300._20_4_ + fStack_28c;
    fStack_288 = auVar300._24_4_ + fStack_288;
    fStack_284 = auVar300._28_4_ + auVar250._28_4_;
    auVar20._4_4_ = fVar185 * fStack_29c;
    auVar20._0_4_ = fVar184 * local_2a0;
    auVar20._8_4_ = fVar186 * fStack_298;
    auVar20._12_4_ = fVar187 * fStack_294;
    auVar20._16_4_ = fVar207 * fStack_290;
    auVar20._20_4_ = fVar208 * fStack_28c;
    auVar20._24_4_ = fVar209 * fStack_288;
    auVar20._28_4_ = auVar300._28_4_ + auVar250._28_4_;
    auVar32._4_4_ = fStack_27c * fVar234;
    auVar32._0_4_ = local_280 * fVar210;
    auVar32._8_4_ = fStack_278 * fVar235;
    auVar32._12_4_ = fStack_274 * fVar236;
    auVar32._16_4_ = fStack_270 * fVar313;
    auVar32._20_4_ = fStack_26c * fVar325;
    auVar32._24_4_ = fStack_268 * fVar330;
    auVar32._28_4_ = fStack_264;
    auVar20 = vsubps_avx(auVar20,auVar32);
    auVar33._4_4_ = fVar185 * auVar21._4_4_;
    auVar33._0_4_ = fVar184 * auVar21._0_4_;
    auVar33._8_4_ = fVar186 * auVar21._8_4_;
    auVar33._12_4_ = fVar187 * auVar21._12_4_;
    auVar33._16_4_ = fVar207 * auVar21._16_4_;
    auVar33._20_4_ = fVar208 * auVar21._20_4_;
    auVar33._24_4_ = fVar209 * auVar21._24_4_;
    auVar33._28_4_ = fStack_264;
    auVar34._4_4_ = fVar234 * fStack_5fc;
    auVar34._0_4_ = fVar210 * local_600;
    auVar34._8_4_ = fVar235 * fStack_5f8;
    auVar34._12_4_ = fVar236 * fStack_5f4;
    auVar34._16_4_ = fVar313 * fStack_5f0;
    auVar34._20_4_ = fVar325 * fStack_5ec;
    auVar34._24_4_ = fVar330 * fStack_5e8;
    auVar34._28_4_ = auVar21._28_4_;
    auVar27 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = fVar185 * local_1e0._4_4_;
    auVar35._0_4_ = fVar184 * local_1e0._0_4_;
    auVar35._8_4_ = fVar186 * local_1e0._8_4_;
    auVar35._12_4_ = fVar187 * local_1e0._12_4_;
    auVar35._16_4_ = fVar207 * local_1e0._16_4_;
    auVar35._20_4_ = fVar208 * local_1e0._20_4_;
    auVar35._24_4_ = fVar209 * local_1e0._24_4_;
    auVar35._28_4_ = auVar110._28_4_ + auVar22._28_4_;
    auVar22._4_4_ = auVar109._4_4_ * fVar234;
    auVar22._0_4_ = auVar109._0_4_ * fVar210;
    auVar22._8_4_ = auVar109._8_4_ * fVar235;
    auVar22._12_4_ = auVar109._12_4_ * fVar236;
    auVar22._16_4_ = auVar109._16_4_ * fVar313;
    auVar22._20_4_ = auVar109._20_4_ * fVar325;
    auVar22._24_4_ = auVar109._24_4_ * fVar330;
    auVar22._28_4_ = auVar144._28_4_ + auVar16._28_4_;
    auVar22 = vsubps_avx(auVar35,auVar22);
    auVar18 = vminps_avx(auVar23,auVar17);
    auVar107 = vmaxps_avx(auVar23,auVar17);
    auVar19 = vminps_avx(auVar24,auVar25);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar24,auVar25);
    auVar107 = vmaxps_avx(auVar107,auVar18);
    auVar16 = vminps_avx(auVar26,auVar20);
    auVar18 = vmaxps_avx(auVar26,auVar20);
    auVar17 = vminps_avx(auVar27,auVar22);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar17 = vminps_avx(auVar19,auVar17);
    auVar19 = vmaxps_avx(auVar27,auVar22);
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar107,auVar18);
    auVar107 = vcmpps_avx(auVar17,local_1c0,2);
    auVar18 = vcmpps_avx(auVar18,local_340,5);
    auVar107 = vandps_avx(auVar18,auVar107);
    auVar18 = local_2c0 & auVar107;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar18 = vsubps_avx(auVar108,local_200);
      auVar19 = vsubps_avx(auVar109,auVar275);
      fVar185 = auVar18._0_4_ + auVar19._0_4_;
      fVar186 = auVar18._4_4_ + auVar19._4_4_;
      fVar187 = auVar18._8_4_ + auVar19._8_4_;
      fVar207 = auVar18._12_4_ + auVar19._12_4_;
      fVar208 = auVar18._16_4_ + auVar19._16_4_;
      fVar209 = auVar18._20_4_ + auVar19._20_4_;
      fVar210 = auVar18._24_4_ + auVar19._24_4_;
      auVar17 = vsubps_avx(local_220,auVar206);
      auVar20 = vsubps_avx(local_1e0,auVar300);
      fVar234 = auVar17._0_4_ + auVar20._0_4_;
      fVar235 = auVar17._4_4_ + auVar20._4_4_;
      fVar236 = auVar17._8_4_ + auVar20._8_4_;
      fVar313 = auVar17._12_4_ + auVar20._12_4_;
      fVar325 = auVar17._16_4_ + auVar20._16_4_;
      fVar330 = auVar17._20_4_ + auVar20._20_4_;
      fVar331 = auVar17._24_4_ + auVar20._24_4_;
      fVar184 = auVar20._28_4_;
      auVar36._4_4_ = auVar206._4_4_ * fVar186;
      auVar36._0_4_ = auVar206._0_4_ * fVar185;
      auVar36._8_4_ = auVar206._8_4_ * fVar187;
      auVar36._12_4_ = auVar206._12_4_ * fVar207;
      auVar36._16_4_ = auVar206._16_4_ * fVar208;
      auVar36._20_4_ = auVar206._20_4_ * fVar209;
      auVar36._24_4_ = auVar206._24_4_ * fVar210;
      auVar36._28_4_ = auVar206._28_4_;
      auVar37._4_4_ = local_200._4_4_ * fVar235;
      auVar37._0_4_ = local_200._0_4_ * fVar234;
      auVar37._8_4_ = local_200._8_4_ * fVar236;
      auVar37._12_4_ = local_200._12_4_ * fVar313;
      auVar37._16_4_ = local_200._16_4_ * fVar325;
      auVar37._20_4_ = local_200._20_4_ * fVar330;
      auVar37._24_4_ = local_200._24_4_ * fVar331;
      auVar37._28_4_ = local_200._28_4_;
      auVar20 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar186 * fStack_25c;
      auVar38._0_4_ = fVar185 * local_260;
      auVar38._8_4_ = fVar187 * fStack_258;
      auVar38._12_4_ = fVar207 * fStack_254;
      auVar38._16_4_ = fVar208 * fStack_250;
      auVar38._20_4_ = fVar209 * fStack_24c;
      auVar38._24_4_ = fVar210 * fStack_248;
      auVar38._28_4_ = auVar206._28_4_;
      auVar39._4_4_ = fVar235 * fStack_23c;
      auVar39._0_4_ = fVar234 * local_240;
      auVar39._8_4_ = fVar236 * fStack_238;
      auVar39._12_4_ = fVar313 * fStack_234;
      auVar39._16_4_ = fVar325 * fStack_230;
      auVar39._20_4_ = fVar330 * fStack_22c;
      auVar39._24_4_ = fVar331 * fStack_228;
      auVar39._28_4_ = fVar184;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar186 * fStack_6bc;
      auVar40._0_4_ = fVar185 * local_6c0;
      auVar40._8_4_ = fVar187 * fStack_6b8;
      auVar40._12_4_ = fVar207 * fStack_6b4;
      auVar40._16_4_ = fVar208 * fStack_6b0;
      auVar40._20_4_ = fVar209 * fStack_6ac;
      auVar40._24_4_ = fVar210 * fStack_6a8;
      auVar40._28_4_ = fVar184;
      auVar41._4_4_ = fVar235 * fStack_69c;
      auVar41._0_4_ = fVar234 * local_6a0;
      auVar41._8_4_ = fVar236 * fStack_698;
      auVar41._12_4_ = fVar313 * fStack_694;
      auVar41._16_4_ = fVar325 * fStack_690;
      auVar41._20_4_ = fVar330 * fStack_68c;
      auVar41._24_4_ = fVar331 * fStack_688;
      auVar41._28_4_ = auVar16._28_4_;
      auVar110 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = local_220._4_4_ * fVar186;
      auVar42._0_4_ = local_220._0_4_ * fVar185;
      auVar42._8_4_ = local_220._8_4_ * fVar187;
      auVar42._12_4_ = local_220._12_4_ * fVar207;
      auVar42._16_4_ = local_220._16_4_ * fVar208;
      auVar42._20_4_ = local_220._20_4_ * fVar209;
      auVar42._24_4_ = local_220._24_4_ * fVar210;
      auVar42._28_4_ = auVar16._28_4_;
      auVar43._4_4_ = auVar108._4_4_ * fVar235;
      auVar43._0_4_ = auVar108._0_4_ * fVar234;
      auVar43._8_4_ = auVar108._8_4_ * fVar236;
      auVar43._12_4_ = auVar108._12_4_ * fVar313;
      auVar43._16_4_ = auVar108._16_4_ * fVar325;
      auVar43._20_4_ = auVar108._20_4_ * fVar330;
      uVar5 = auVar108._28_4_;
      auVar43._24_4_ = auVar108._24_4_ * fVar331;
      auVar43._28_4_ = uVar5;
      auVar108 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar300._4_4_ * fVar186;
      auVar44._0_4_ = auVar300._0_4_ * fVar185;
      auVar44._8_4_ = auVar300._8_4_ * fVar187;
      auVar44._12_4_ = auVar300._12_4_ * fVar207;
      auVar44._16_4_ = auVar300._16_4_ * fVar208;
      auVar44._20_4_ = auVar300._20_4_ * fVar209;
      auVar44._24_4_ = auVar300._24_4_ * fVar210;
      auVar44._28_4_ = uVar5;
      auVar45._4_4_ = auVar275._4_4_ * fVar235;
      auVar45._0_4_ = auVar275._0_4_ * fVar234;
      auVar45._8_4_ = auVar275._8_4_ * fVar236;
      auVar45._12_4_ = auVar275._12_4_ * fVar313;
      auVar45._16_4_ = auVar275._16_4_ * fVar325;
      auVar45._20_4_ = auVar275._20_4_ * fVar330;
      auVar45._24_4_ = auVar275._24_4_ * fVar331;
      auVar45._28_4_ = auVar275._28_4_;
      auVar144 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar186 * fStack_29c;
      auVar46._0_4_ = fVar185 * local_2a0;
      auVar46._8_4_ = fVar187 * fStack_298;
      auVar46._12_4_ = fVar207 * fStack_294;
      auVar46._16_4_ = fVar208 * fStack_290;
      auVar46._20_4_ = fVar209 * fStack_28c;
      auVar46._24_4_ = fVar210 * fStack_288;
      auVar46._28_4_ = uVar5;
      auVar47._4_4_ = fVar235 * fStack_27c;
      auVar47._0_4_ = fVar234 * local_280;
      auVar47._8_4_ = fVar236 * fStack_278;
      auVar47._12_4_ = fVar313 * fStack_274;
      auVar47._16_4_ = fVar325 * fStack_270;
      auVar47._20_4_ = fVar330 * fStack_26c;
      auVar47._24_4_ = fVar331 * fStack_268;
      auVar47._28_4_ = auVar300._28_4_;
      auVar23 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar186 * auVar21._4_4_;
      auVar48._0_4_ = fVar185 * auVar21._0_4_;
      auVar48._8_4_ = fVar187 * auVar21._8_4_;
      auVar48._12_4_ = fVar207 * auVar21._12_4_;
      auVar48._16_4_ = fVar208 * auVar21._16_4_;
      auVar48._20_4_ = fVar209 * auVar21._20_4_;
      auVar48._24_4_ = fVar210 * auVar21._24_4_;
      auVar48._28_4_ = auVar300._28_4_;
      auVar49._4_4_ = fStack_5fc * fVar235;
      auVar49._0_4_ = local_600 * fVar234;
      auVar49._8_4_ = fStack_5f8 * fVar236;
      auVar49._12_4_ = fStack_5f4 * fVar313;
      auVar49._16_4_ = fStack_5f0 * fVar325;
      auVar49._20_4_ = fStack_5ec * fVar330;
      auVar49._24_4_ = fStack_5e8 * fVar331;
      auVar49._28_4_ = local_220._28_4_;
      auVar21 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = local_1e0._4_4_ * fVar186;
      auVar50._0_4_ = local_1e0._0_4_ * fVar185;
      auVar50._8_4_ = local_1e0._8_4_ * fVar187;
      auVar50._12_4_ = local_1e0._12_4_ * fVar207;
      auVar50._16_4_ = local_1e0._16_4_ * fVar208;
      auVar50._20_4_ = local_1e0._20_4_ * fVar209;
      auVar50._24_4_ = local_1e0._24_4_ * fVar210;
      auVar50._28_4_ = auVar18._28_4_ + auVar19._28_4_;
      auVar51._4_4_ = auVar109._4_4_ * fVar235;
      auVar51._0_4_ = auVar109._0_4_ * fVar234;
      auVar51._8_4_ = auVar109._8_4_ * fVar236;
      auVar51._12_4_ = auVar109._12_4_ * fVar313;
      auVar51._16_4_ = auVar109._16_4_ * fVar325;
      auVar51._20_4_ = auVar109._20_4_ * fVar330;
      auVar51._24_4_ = auVar109._24_4_ * fVar331;
      auVar51._28_4_ = auVar17._28_4_ + fVar184;
      auVar109 = vsubps_avx(auVar50,auVar51);
      auVar19 = vminps_avx(auVar20,auVar22);
      auVar18 = vmaxps_avx(auVar20,auVar22);
      auVar16 = vminps_avx(auVar110,auVar108);
      auVar16 = vminps_avx(auVar19,auVar16);
      auVar19 = vmaxps_avx(auVar110,auVar108);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar17 = vminps_avx(auVar144,auVar23);
      auVar19 = vmaxps_avx(auVar144,auVar23);
      auVar108 = vminps_avx(auVar21,auVar109);
      auVar17 = vminps_avx(auVar17,auVar108);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar21,auVar109);
      auVar19 = vmaxps_avx(auVar19,auVar16);
      auVar19 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vcmpps_avx(auVar17,local_1c0,2);
      auVar19 = vcmpps_avx(auVar19,local_340,5);
      auVar18 = vandps_avx(auVar19,auVar18);
      auVar107 = vandps_avx(local_2c0,auVar107);
      auVar19 = auVar107 & auVar18;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar107 = vandps_avx(auVar18,auVar107);
        uVar70 = vmovmskps_avx(auVar107);
        if (uVar70 != 0) {
          uVar67 = (ulong)uVar71;
          auStack_490[uVar67] = uVar70 & 0xff;
          uVar6 = vmovlps_avx(local_400);
          *(undefined8 *)(afStack_320 + uVar67 * 2) = uVar6;
          uVar64 = vmovlps_avx(auVar92);
          auStack_1a0[uVar67] = uVar64;
          uVar71 = uVar71 + 1;
        }
      }
    }
LAB_00f8e181:
    do {
      do {
        do {
          do {
            if (uVar71 == 0) {
              if (bVar72) {
                return bVar72;
              }
              uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar106._4_4_ = uVar5;
              auVar106._0_4_ = uVar5;
              auVar106._8_4_ = uVar5;
              auVar106._12_4_ = uVar5;
              auVar84 = vcmpps_avx(local_410,auVar106,2);
              uVar66 = vmovmskps_avx(auVar84);
              uVar62 = uVar62 & local_528 & uVar66;
              if (uVar62 == 0) {
                return bVar72;
              }
              goto LAB_00f8cec6;
            }
            uVar67 = (ulong)(uVar71 - 1);
            uVar70 = auStack_490[uVar67];
            fVar184 = afStack_320[uVar67 * 2];
            fVar185 = afStack_320[uVar67 * 2 + 1];
            auVar92._8_8_ = 0;
            auVar92._0_8_ = auStack_1a0[uVar67];
            uVar64 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            auStack_490[uVar67] = uVar70;
            if (uVar70 == 0) {
              uVar71 = uVar71 - 1;
            }
            fVar187 = (float)(uVar64 + 1) * 0.14285715;
            fVar186 = (1.0 - (float)uVar64 * 0.14285715) * fVar184 +
                      fVar185 * (float)uVar64 * 0.14285715;
            fVar184 = (1.0 - fVar187) * fVar184 + fVar185 * fVar187;
            fVar185 = fVar184 - fVar186;
            if (0.16666667 <= fVar185) {
              local_400 = vinsertps_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar184),0x10);
              goto LAB_00f8db4c;
            }
            auVar84 = vshufps_avx(auVar92,auVar92,0x50);
            auVar126._8_4_ = 0x3f800000;
            auVar126._0_8_ = 0x3f8000003f800000;
            auVar126._12_4_ = 0x3f800000;
            auVar194 = vsubps_avx(auVar126,auVar84);
            fVar187 = auVar84._0_4_;
            fVar207 = auVar84._4_4_;
            fVar208 = auVar84._8_4_;
            fVar209 = auVar84._12_4_;
            fVar210 = auVar194._0_4_;
            fVar234 = auVar194._4_4_;
            fVar235 = auVar194._8_4_;
            fVar236 = auVar194._12_4_;
            auVar166._0_4_ = fVar187 * auVar285._0_4_ + fVar210 * (float)local_6f0._0_4_;
            auVar166._4_4_ = fVar207 * auVar285._4_4_ + fVar234 * (float)local_6f0._4_4_;
            auVar166._8_4_ = fVar208 * auVar285._0_4_ + fVar235 * (float)local_6f0._0_4_;
            auVar166._12_4_ = fVar209 * auVar285._4_4_ + fVar236 * (float)local_6f0._4_4_;
            auVar221._0_4_ = fVar187 * auVar293._0_4_ + fVar210 * auVar350._0_4_;
            auVar221._4_4_ = fVar207 * auVar293._4_4_ + fVar234 * auVar350._4_4_;
            auVar221._8_4_ = fVar208 * auVar293._0_4_ + fVar235 * auVar350._0_4_;
            auVar221._12_4_ = fVar209 * auVar293._4_4_ + fVar236 * auVar350._4_4_;
            auVar242._0_4_ = fVar187 * auVar307._0_4_ + auVar340._0_4_ * fVar210;
            auVar242._4_4_ = fVar207 * auVar307._4_4_ + auVar340._4_4_ * fVar234;
            auVar242._8_4_ = fVar208 * auVar307._0_4_ + auVar340._0_4_ * fVar235;
            auVar242._12_4_ = fVar209 * auVar307._4_4_ + auVar340._4_4_ * fVar236;
            auVar93._0_4_ = fVar187 * auVar90._0_4_ + fVar210 * auVar125._0_4_;
            auVar93._4_4_ = fVar207 * auVar90._4_4_ + fVar234 * auVar125._4_4_;
            auVar93._8_4_ = fVar208 * auVar90._0_4_ + fVar235 * auVar125._0_4_;
            auVar93._12_4_ = fVar209 * auVar90._4_4_ + fVar236 * auVar125._4_4_;
            auVar145._16_16_ = auVar166;
            auVar145._0_16_ = auVar166;
            auVar181._16_16_ = auVar221;
            auVar181._0_16_ = auVar221;
            auVar233._16_16_ = auVar242;
            auVar233._0_16_ = auVar242;
            auVar107 = ZEXT2032(CONCAT416(fVar184,ZEXT416((uint)fVar186)));
            auVar107 = vshufps_avx(auVar107,auVar107,0);
            auVar18 = vsubps_avx(auVar181,auVar145);
            fVar187 = auVar107._0_4_;
            fVar207 = auVar107._4_4_;
            fVar208 = auVar107._8_4_;
            fVar209 = auVar107._12_4_;
            fVar210 = auVar107._16_4_;
            fVar234 = auVar107._20_4_;
            fVar235 = auVar107._24_4_;
            auVar146._0_4_ = auVar166._0_4_ + auVar18._0_4_ * fVar187;
            auVar146._4_4_ = auVar166._4_4_ + auVar18._4_4_ * fVar207;
            auVar146._8_4_ = auVar166._8_4_ + auVar18._8_4_ * fVar208;
            auVar146._12_4_ = auVar166._12_4_ + auVar18._12_4_ * fVar209;
            auVar146._16_4_ = auVar166._0_4_ + auVar18._16_4_ * fVar210;
            auVar146._20_4_ = auVar166._4_4_ + auVar18._20_4_ * fVar234;
            auVar146._24_4_ = auVar166._8_4_ + auVar18._24_4_ * fVar235;
            auVar146._28_4_ = auVar166._12_4_ + auVar18._28_4_;
            auVar107 = vsubps_avx(auVar233,auVar181);
            auVar182._0_4_ = auVar221._0_4_ + auVar107._0_4_ * fVar187;
            auVar182._4_4_ = auVar221._4_4_ + auVar107._4_4_ * fVar207;
            auVar182._8_4_ = auVar221._8_4_ + auVar107._8_4_ * fVar208;
            auVar182._12_4_ = auVar221._12_4_ + auVar107._12_4_ * fVar209;
            auVar182._16_4_ = auVar221._0_4_ + auVar107._16_4_ * fVar210;
            auVar182._20_4_ = auVar221._4_4_ + auVar107._20_4_ * fVar234;
            auVar182._24_4_ = auVar221._8_4_ + auVar107._24_4_ * fVar235;
            auVar182._28_4_ = auVar221._12_4_ + auVar107._28_4_;
            auVar84 = vsubps_avx(auVar93,auVar242);
            auVar111._0_4_ = auVar242._0_4_ + auVar84._0_4_ * fVar187;
            auVar111._4_4_ = auVar242._4_4_ + auVar84._4_4_ * fVar207;
            auVar111._8_4_ = auVar242._8_4_ + auVar84._8_4_ * fVar208;
            auVar111._12_4_ = auVar242._12_4_ + auVar84._12_4_ * fVar209;
            auVar111._16_4_ = auVar242._0_4_ + auVar84._0_4_ * fVar210;
            auVar111._20_4_ = auVar242._4_4_ + auVar84._4_4_ * fVar234;
            auVar111._24_4_ = auVar242._8_4_ + auVar84._8_4_ * fVar235;
            auVar111._28_4_ = auVar242._12_4_ + auVar84._12_4_;
            auVar107 = vsubps_avx(auVar182,auVar146);
            auVar147._0_4_ = auVar146._0_4_ + fVar187 * auVar107._0_4_;
            auVar147._4_4_ = auVar146._4_4_ + fVar207 * auVar107._4_4_;
            auVar147._8_4_ = auVar146._8_4_ + fVar208 * auVar107._8_4_;
            auVar147._12_4_ = auVar146._12_4_ + fVar209 * auVar107._12_4_;
            auVar147._16_4_ = auVar146._16_4_ + fVar210 * auVar107._16_4_;
            auVar147._20_4_ = auVar146._20_4_ + fVar234 * auVar107._20_4_;
            auVar147._24_4_ = auVar146._24_4_ + fVar235 * auVar107._24_4_;
            auVar147._28_4_ = auVar146._28_4_ + auVar107._28_4_;
            auVar107 = vsubps_avx(auVar111,auVar182);
            auVar112._0_4_ = auVar182._0_4_ + fVar187 * auVar107._0_4_;
            auVar112._4_4_ = auVar182._4_4_ + fVar207 * auVar107._4_4_;
            auVar112._8_4_ = auVar182._8_4_ + fVar208 * auVar107._8_4_;
            auVar112._12_4_ = auVar182._12_4_ + fVar209 * auVar107._12_4_;
            auVar112._16_4_ = auVar182._16_4_ + fVar210 * auVar107._16_4_;
            auVar112._20_4_ = auVar182._20_4_ + fVar234 * auVar107._20_4_;
            auVar112._24_4_ = auVar182._24_4_ + fVar235 * auVar107._24_4_;
            auVar112._28_4_ = auVar182._28_4_ + auVar107._28_4_;
            auVar107 = vsubps_avx(auVar112,auVar147);
            auVar262._0_4_ = auVar147._0_4_ + fVar187 * auVar107._0_4_;
            auVar262._4_4_ = auVar147._4_4_ + fVar207 * auVar107._4_4_;
            auVar262._8_4_ = auVar147._8_4_ + fVar208 * auVar107._8_4_;
            auVar262._12_4_ = auVar147._12_4_ + fVar209 * auVar107._12_4_;
            auVar265._16_4_ = auVar147._16_4_ + fVar210 * auVar107._16_4_;
            auVar265._0_16_ = auVar262;
            auVar265._20_4_ = auVar147._20_4_ + fVar234 * auVar107._20_4_;
            auVar265._24_4_ = auVar147._24_4_ + fVar235 * auVar107._24_4_;
            auVar265._28_4_ = auVar147._28_4_ + auVar182._28_4_;
            auVar83 = auVar265._16_16_;
            auVar128 = vshufps_avx(ZEXT416((uint)(fVar185 * 0.33333334)),
                                   ZEXT416((uint)(fVar185 * 0.33333334)),0);
            auVar243._0_4_ = auVar262._0_4_ + auVar128._0_4_ * auVar107._0_4_ * 3.0;
            auVar243._4_4_ = auVar262._4_4_ + auVar128._4_4_ * auVar107._4_4_ * 3.0;
            auVar243._8_4_ = auVar262._8_4_ + auVar128._8_4_ * auVar107._8_4_ * 3.0;
            auVar243._12_4_ = auVar262._12_4_ + auVar128._12_4_ * auVar107._12_4_ * 3.0;
            auVar179 = vshufpd_avx(auVar262,auVar262,3);
            auVar139 = vshufpd_avx(auVar83,auVar83,3);
            auVar84 = vsubps_avx(auVar179,auVar262);
            auVar194 = vsubps_avx(auVar139,auVar83);
            auVar94._0_4_ = auVar84._0_4_ + auVar194._0_4_;
            auVar94._4_4_ = auVar84._4_4_ + auVar194._4_4_;
            auVar94._8_4_ = auVar84._8_4_ + auVar194._8_4_;
            auVar94._12_4_ = auVar84._12_4_ + auVar194._12_4_;
            auVar84 = vmovshdup_avx(auVar262);
            auVar194 = vmovshdup_avx(auVar243);
            auVar169 = vshufps_avx(auVar94,auVar94,0);
            auVar129 = vshufps_avx(auVar94,auVar94,0x55);
            fVar187 = auVar129._0_4_;
            fVar207 = auVar129._4_4_;
            fVar208 = auVar129._8_4_;
            fVar209 = auVar129._12_4_;
            fVar210 = auVar169._0_4_;
            fVar234 = auVar169._4_4_;
            fVar235 = auVar169._8_4_;
            fVar236 = auVar169._12_4_;
            auVar95._0_4_ = fVar210 * auVar262._0_4_ + auVar84._0_4_ * fVar187;
            auVar95._4_4_ = fVar234 * auVar262._4_4_ + auVar84._4_4_ * fVar207;
            auVar95._8_4_ = fVar235 * auVar262._8_4_ + auVar84._8_4_ * fVar208;
            auVar95._12_4_ = fVar236 * auVar262._12_4_ + auVar84._12_4_ * fVar209;
            auVar167._0_4_ = fVar210 * auVar243._0_4_ + auVar194._0_4_ * fVar187;
            auVar167._4_4_ = fVar234 * auVar243._4_4_ + auVar194._4_4_ * fVar207;
            auVar167._8_4_ = fVar235 * auVar243._8_4_ + auVar194._8_4_ * fVar208;
            auVar167._12_4_ = fVar236 * auVar243._12_4_ + auVar194._12_4_ * fVar209;
            auVar194 = vshufps_avx(auVar95,auVar95,0xe8);
            auVar169 = vshufps_avx(auVar167,auVar167,0xe8);
            auVar84 = vcmpps_avx(auVar194,auVar169,1);
            uVar70 = vextractps_avx(auVar84,0);
            auVar129 = auVar167;
            if ((uVar70 & 1) == 0) {
              auVar129 = auVar95;
            }
            auVar127._0_4_ = auVar128._0_4_ * auVar107._16_4_ * 3.0;
            auVar127._4_4_ = auVar128._4_4_ * auVar107._20_4_ * 3.0;
            auVar127._8_4_ = auVar128._8_4_ * auVar107._24_4_ * 3.0;
            auVar127._12_4_ = auVar128._12_4_ * 0.0;
            auVar73 = vsubps_avx(auVar83,auVar127);
            auVar128 = vmovshdup_avx(auVar73);
            auVar83 = vmovshdup_avx(auVar83);
            fVar313 = auVar73._0_4_;
            fVar325 = auVar73._4_4_;
            auVar222._0_4_ = fVar313 * fVar210 + auVar128._0_4_ * fVar187;
            auVar222._4_4_ = fVar325 * fVar234 + auVar128._4_4_ * fVar207;
            auVar222._8_4_ = auVar73._8_4_ * fVar235 + auVar128._8_4_ * fVar208;
            auVar222._12_4_ = auVar73._12_4_ * fVar236 + auVar128._12_4_ * fVar209;
            auVar244._0_4_ = fVar210 * auVar265._16_4_ + auVar83._0_4_ * fVar187;
            auVar244._4_4_ = fVar234 * auVar265._20_4_ + auVar83._4_4_ * fVar207;
            auVar244._8_4_ = fVar235 * auVar265._24_4_ + auVar83._8_4_ * fVar208;
            auVar244._12_4_ = fVar236 * auVar265._28_4_ + auVar83._12_4_ * fVar209;
            auVar83 = vshufps_avx(auVar222,auVar222,0xe8);
            auVar272 = vshufps_avx(auVar244,auVar244,0xe8);
            auVar128 = vcmpps_avx(auVar83,auVar272,1);
            uVar70 = vextractps_avx(auVar128,0);
            auVar74 = auVar244;
            if ((uVar70 & 1) == 0) {
              auVar74 = auVar222;
            }
            auVar129 = vmaxss_avx(auVar74,auVar129);
            auVar194 = vminps_avx(auVar194,auVar169);
            auVar169 = vminps_avx(auVar83,auVar272);
            auVar169 = vminps_avx(auVar194,auVar169);
            auVar84 = vshufps_avx(auVar84,auVar84,0x55);
            auVar84 = vblendps_avx(auVar84,auVar128,2);
            auVar128 = vpslld_avx(auVar84,0x1f);
            auVar84 = vshufpd_avx(auVar167,auVar167,1);
            auVar84 = vinsertps_avx(auVar84,auVar244,0x9c);
            auVar194 = vshufpd_avx(auVar95,auVar95,1);
            auVar194 = vinsertps_avx(auVar194,auVar222,0x9c);
            auVar84 = vblendvps_avx(auVar194,auVar84,auVar128);
            auVar194 = vmovshdup_avx(auVar84);
            auVar84 = vmaxss_avx(auVar194,auVar84);
            fVar208 = auVar169._0_4_;
            auVar194 = vmovshdup_avx(auVar169);
            fVar207 = auVar84._0_4_;
            fVar209 = auVar194._0_4_;
            fVar187 = auVar129._0_4_;
            if ((fVar208 < 0.0001) && (-0.0001 < fVar207)) break;
            if ((fVar209 < 0.0001 && -0.0001 < fVar187) || (fVar208 < 0.0001 && -0.0001 < fVar187))
            break;
            auVar128 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar84,1);
            auVar194 = vcmpps_avx(auVar194,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar194 = vandps_avx(auVar194,auVar128);
          } while ((auVar194 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar128 = vcmpps_avx(auVar169,_DAT_01f7aa10,1);
          auVar194 = vcmpss_avx(auVar129,ZEXT416(0),1);
          auVar168._8_4_ = 0x3f800000;
          auVar168._0_8_ = 0x3f8000003f800000;
          auVar168._12_4_ = 0x3f800000;
          auVar223._8_4_ = 0xbf800000;
          auVar223._0_8_ = 0xbf800000bf800000;
          auVar223._12_4_ = 0xbf800000;
          auVar194 = vblendvps_avx(auVar168,auVar223,auVar194);
          auVar128 = vblendvps_avx(auVar168,auVar223,auVar128);
          auVar169 = vcmpss_avx(auVar128,auVar194,4);
          auVar169 = vpshufd_avx(ZEXT416(auVar169._0_4_ & 1),0x50);
          auVar169 = vpslld_avx(auVar169,0x1f);
          auVar169 = vpsrad_avx(auVar169,0x1f);
          auVar169 = vpandn_avx(auVar169,_DAT_01fafeb0);
          auVar129 = vmovshdup_avx(auVar128);
          fVar210 = auVar129._0_4_;
          if ((auVar128._0_4_ != fVar210) || (NAN(auVar128._0_4_) || NAN(fVar210))) {
            if ((fVar209 != fVar208) || (NAN(fVar209) || NAN(fVar208))) {
              fVar208 = -fVar208 / (fVar209 - fVar208);
              auVar128 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar208) * 0.0 + fVar208)));
            }
            else {
              auVar128 = ZEXT816(0x3f80000000000000);
              if ((fVar208 != 0.0) || (NAN(fVar208))) {
                auVar128 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar83 = vcmpps_avx(auVar169,auVar128,1);
            auVar129 = vblendps_avx(auVar169,auVar128,2);
            auVar128 = vblendps_avx(auVar128,auVar169,2);
            auVar169 = vblendvps_avx(auVar128,auVar129,auVar83);
          }
          auVar84 = vcmpss_avx(auVar84,ZEXT416(0),1);
          auVar170._8_4_ = 0x3f800000;
          auVar170._0_8_ = 0x3f8000003f800000;
          auVar170._12_4_ = 0x3f800000;
          auVar224._8_4_ = 0xbf800000;
          auVar224._0_8_ = 0xbf800000bf800000;
          auVar224._12_4_ = 0xbf800000;
          auVar84 = vblendvps_avx(auVar170,auVar224,auVar84);
          fVar208 = auVar84._0_4_;
          if ((auVar194._0_4_ != fVar208) || (NAN(auVar194._0_4_) || NAN(fVar208))) {
            if ((fVar207 != fVar187) || (NAN(fVar207) || NAN(fVar187))) {
              fVar187 = -fVar187 / (fVar207 - fVar187);
              auVar84 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar187) * 0.0 + fVar187)));
            }
            else {
              auVar84 = ZEXT816(0x3f80000000000000);
              if ((fVar187 != 0.0) || (NAN(fVar187))) {
                auVar84 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar128 = vcmpps_avx(auVar169,auVar84,1);
            auVar194 = vblendps_avx(auVar169,auVar84,2);
            auVar84 = vblendps_avx(auVar84,auVar169,2);
            auVar169 = vblendvps_avx(auVar84,auVar194,auVar128);
          }
          if ((fVar210 != fVar208) || (NAN(fVar210) || NAN(fVar208))) {
            auVar96._8_4_ = 0x3f800000;
            auVar96._0_8_ = 0x3f8000003f800000;
            auVar96._12_4_ = 0x3f800000;
            auVar84 = vcmpps_avx(auVar169,auVar96,1);
            auVar194 = vinsertps_avx(auVar169,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar171._4_12_ = auVar169._4_12_;
            auVar171._0_4_ = 0x3f800000;
            auVar169 = vblendvps_avx(auVar171,auVar194,auVar84);
          }
          auVar84 = vcmpps_avx(auVar169,_DAT_01f7b6f0,1);
          auVar53._12_4_ = 0;
          auVar53._0_12_ = auVar169._4_12_;
          auVar194 = vinsertps_avx(auVar169,ZEXT416(0x3f800000),0x10);
          auVar84 = vblendvps_avx(auVar194,auVar53 << 0x20,auVar84);
          auVar194 = vmovshdup_avx(auVar84);
        } while (auVar194._0_4_ < auVar84._0_4_);
        auVar97._0_4_ = auVar84._0_4_ + -0.1;
        auVar97._4_4_ = auVar84._4_4_ + 0.1;
        auVar97._8_4_ = auVar84._8_4_ + 0.0;
        auVar97._12_4_ = auVar84._12_4_ + 0.0;
        auVar128 = vshufpd_avx(auVar243,auVar243,3);
        auVar263._8_8_ = 0x3f80000000000000;
        auVar263._0_8_ = 0x3f80000000000000;
        auVar84 = vcmpps_avx(auVar97,auVar263,1);
        auVar52._12_4_ = 0;
        auVar52._0_12_ = auVar97._4_12_;
        auVar194 = vinsertps_avx(auVar97,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar84 = vblendvps_avx(auVar194,auVar52 << 0x20,auVar84);
        auVar194 = vshufpd_avx(auVar73,auVar73,3);
        auVar169 = vshufps_avx(auVar84,auVar84,0x50);
        auVar264._8_4_ = 0x3f800000;
        auVar264._0_8_ = 0x3f8000003f800000;
        auVar264._12_4_ = 0x3f800000;
        auVar129 = vsubps_avx(auVar264,auVar169);
        local_5e0 = auVar179._0_4_;
        fStack_5dc = auVar179._4_4_;
        fStack_5d8 = auVar179._8_4_;
        fStack_5d4 = auVar179._12_4_;
        fVar187 = auVar169._0_4_;
        fVar207 = auVar169._4_4_;
        fVar208 = auVar169._8_4_;
        fVar209 = auVar169._12_4_;
        local_680 = auVar139._0_4_;
        fStack_67c = auVar139._4_4_;
        fStack_678 = auVar139._8_4_;
        fStack_674 = auVar139._12_4_;
        fVar210 = auVar129._0_4_;
        fVar234 = auVar129._4_4_;
        fVar235 = auVar129._8_4_;
        fVar236 = auVar129._12_4_;
        auVar98._0_4_ = fVar187 * local_5e0 + fVar210 * auVar262._0_4_;
        auVar98._4_4_ = fVar207 * fStack_5dc + fVar234 * auVar262._4_4_;
        auVar98._8_4_ = fVar208 * fStack_5d8 + fVar235 * auVar262._0_4_;
        auVar98._12_4_ = fVar209 * fStack_5d4 + fVar236 * auVar262._4_4_;
        auVar172._0_4_ = fVar187 * auVar128._0_4_ + fVar210 * auVar243._0_4_;
        auVar172._4_4_ = fVar207 * auVar128._4_4_ + fVar234 * auVar243._4_4_;
        auVar172._8_4_ = fVar208 * auVar128._8_4_ + fVar235 * auVar243._0_4_;
        auVar172._12_4_ = fVar209 * auVar128._12_4_ + fVar236 * auVar243._4_4_;
        auVar245._0_4_ = fVar187 * auVar194._0_4_ + fVar210 * fVar313;
        auVar245._4_4_ = fVar207 * auVar194._4_4_ + fVar234 * fVar325;
        auVar245._8_4_ = fVar208 * auVar194._8_4_ + fVar235 * fVar313;
        auVar245._12_4_ = fVar209 * auVar194._12_4_ + fVar236 * fVar325;
        auVar274._0_4_ = fVar187 * local_680 + fVar210 * auVar265._16_4_;
        auVar274._4_4_ = fVar207 * fStack_67c + fVar234 * auVar265._20_4_;
        auVar274._8_4_ = fVar208 * fStack_678 + fVar235 * auVar265._16_4_;
        auVar274._12_4_ = fVar209 * fStack_674 + fVar236 * auVar265._20_4_;
        auVar139 = vsubps_avx(auVar264,auVar84);
        auVar194 = vmovshdup_avx(auVar92);
        auVar179 = vmovsldup_avx(auVar92);
        auVar92._0_4_ = auVar179._0_4_ * auVar139._0_4_ + auVar84._0_4_ * auVar194._0_4_;
        auVar92._4_4_ = auVar179._4_4_ * auVar139._4_4_ + auVar84._4_4_ * auVar194._4_4_;
        auVar92._8_4_ = auVar179._8_4_ * auVar139._8_4_ + auVar84._8_4_ * auVar194._8_4_;
        auVar92._12_4_ = auVar179._12_4_ * auVar139._12_4_ + auVar84._12_4_ * auVar194._12_4_;
        auVar73 = vmovshdup_avx(auVar92);
        auVar84 = vsubps_avx(auVar172,auVar98);
        auVar204._0_4_ = auVar84._0_4_ * 3.0;
        auVar204._4_4_ = auVar84._4_4_ * 3.0;
        auVar204._8_4_ = auVar84._8_4_ * 3.0;
        auVar204._12_4_ = auVar84._12_4_ * 3.0;
        auVar84 = vsubps_avx(auVar245,auVar172);
        auVar286._0_4_ = auVar84._0_4_ * 3.0;
        auVar286._4_4_ = auVar84._4_4_ * 3.0;
        auVar286._8_4_ = auVar84._8_4_ * 3.0;
        auVar286._12_4_ = auVar84._12_4_ * 3.0;
        auVar84 = vsubps_avx(auVar274,auVar245);
        auVar294._0_4_ = auVar84._0_4_ * 3.0;
        auVar294._4_4_ = auVar84._4_4_ * 3.0;
        auVar294._8_4_ = auVar84._8_4_ * 3.0;
        auVar294._12_4_ = auVar84._12_4_ * 3.0;
        auVar194 = vminps_avx(auVar286,auVar294);
        auVar84 = vmaxps_avx(auVar286,auVar294);
        auVar194 = vminps_avx(auVar204,auVar194);
        auVar84 = vmaxps_avx(auVar204,auVar84);
        auVar179 = vshufpd_avx(auVar194,auVar194,3);
        auVar139 = vshufpd_avx(auVar84,auVar84,3);
        auVar194 = vminps_avx(auVar194,auVar179);
        auVar84 = vmaxps_avx(auVar84,auVar139);
        auVar179 = vshufps_avx(ZEXT416((uint)(1.0 / fVar185)),ZEXT416((uint)(1.0 / fVar185)),0);
        auVar287._0_4_ = auVar194._0_4_ * auVar179._0_4_;
        auVar287._4_4_ = auVar194._4_4_ * auVar179._4_4_;
        auVar287._8_4_ = auVar194._8_4_ * auVar179._8_4_;
        auVar287._12_4_ = auVar194._12_4_ * auVar179._12_4_;
        auVar295._0_4_ = auVar179._0_4_ * auVar84._0_4_;
        auVar295._4_4_ = auVar179._4_4_ * auVar84._4_4_;
        auVar295._8_4_ = auVar179._8_4_ * auVar84._8_4_;
        auVar295._12_4_ = auVar179._12_4_ * auVar84._12_4_;
        auVar129 = ZEXT416((uint)(1.0 / (auVar73._0_4_ - auVar92._0_4_)));
        auVar84 = vshufpd_avx(auVar98,auVar98,3);
        auVar194 = vshufpd_avx(auVar172,auVar172,3);
        auVar179 = vshufpd_avx(auVar245,auVar245,3);
        auVar139 = vshufpd_avx(auVar274,auVar274,3);
        auVar84 = vsubps_avx(auVar84,auVar98);
        auVar128 = vsubps_avx(auVar194,auVar172);
        auVar169 = vsubps_avx(auVar179,auVar245);
        auVar139 = vsubps_avx(auVar139,auVar274);
        auVar194 = vminps_avx(auVar84,auVar128);
        auVar84 = vmaxps_avx(auVar84,auVar128);
        auVar179 = vminps_avx(auVar169,auVar139);
        auVar179 = vminps_avx(auVar194,auVar179);
        auVar194 = vmaxps_avx(auVar169,auVar139);
        auVar84 = vmaxps_avx(auVar84,auVar194);
        auVar194 = vshufps_avx(auVar129,auVar129,0);
        auVar341._0_4_ = auVar194._0_4_ * auVar179._0_4_;
        auVar341._4_4_ = auVar194._4_4_ * auVar179._4_4_;
        auVar341._8_4_ = auVar194._8_4_ * auVar179._8_4_;
        auVar341._12_4_ = auVar194._12_4_ * auVar179._12_4_;
        auVar352._0_4_ = auVar194._0_4_ * auVar84._0_4_;
        auVar352._4_4_ = auVar194._4_4_ * auVar84._4_4_;
        auVar352._8_4_ = auVar194._8_4_ * auVar84._8_4_;
        auVar352._12_4_ = auVar194._12_4_ * auVar84._12_4_;
        auVar84 = vmovsldup_avx(auVar92);
        auVar308._4_12_ = auVar84._4_12_;
        auVar308._0_4_ = fVar186;
        auVar317._4_12_ = auVar92._4_12_;
        auVar317._0_4_ = fVar184;
        auVar205._0_4_ = (fVar186 + fVar184) * 0.5;
        auVar205._4_4_ = (auVar84._4_4_ + auVar92._4_4_) * 0.5;
        auVar205._8_4_ = (auVar84._8_4_ + auVar92._8_4_) * 0.5;
        auVar205._12_4_ = (auVar84._12_4_ + auVar92._12_4_) * 0.5;
        auVar84 = vshufps_avx(auVar205,auVar205,0);
        fVar187 = auVar84._0_4_;
        fVar207 = auVar84._4_4_;
        fVar208 = auVar84._8_4_;
        fVar209 = auVar84._12_4_;
        local_610 = auVar281._0_4_;
        fStack_60c = auVar281._4_4_;
        fStack_608 = auVar281._8_4_;
        fStack_604 = auVar281._12_4_;
        auVar130._0_4_ = fVar187 * (float)local_350._0_4_ + local_610;
        auVar130._4_4_ = fVar207 * (float)local_350._4_4_ + fStack_60c;
        auVar130._8_4_ = fVar208 * fStack_348 + fStack_608;
        auVar130._12_4_ = fVar209 * fStack_344 + fStack_604;
        local_620._0_4_ = auVar15._0_4_;
        local_620._4_4_ = auVar15._4_4_;
        fStack_618 = auVar15._8_4_;
        fStack_614 = auVar15._12_4_;
        auVar173._0_4_ = fVar187 * (float)local_360._0_4_ + (float)local_620._0_4_;
        auVar173._4_4_ = fVar207 * (float)local_360._4_4_ + (float)local_620._4_4_;
        auVar173._8_4_ = fVar208 * fStack_358 + fStack_618;
        auVar173._12_4_ = fVar209 * fStack_354 + fStack_614;
        local_630 = auVar163._0_4_;
        fStack_62c = auVar163._4_4_;
        fStack_628 = auVar163._8_4_;
        fStack_624 = auVar163._12_4_;
        auVar246._0_4_ = fVar187 * (float)local_370._0_4_ + local_630;
        auVar246._4_4_ = fVar207 * (float)local_370._4_4_ + fStack_62c;
        auVar246._8_4_ = fVar208 * fStack_368 + fStack_628;
        auVar246._12_4_ = fVar209 * fStack_364 + fStack_624;
        auVar84 = vsubps_avx(auVar173,auVar130);
        auVar131._0_4_ = auVar130._0_4_ + fVar187 * auVar84._0_4_;
        auVar131._4_4_ = auVar130._4_4_ + fVar207 * auVar84._4_4_;
        auVar131._8_4_ = auVar130._8_4_ + fVar208 * auVar84._8_4_;
        auVar131._12_4_ = auVar130._12_4_ + fVar209 * auVar84._12_4_;
        auVar84 = vsubps_avx(auVar246,auVar173);
        auVar174._0_4_ = auVar173._0_4_ + fVar187 * auVar84._0_4_;
        auVar174._4_4_ = auVar173._4_4_ + fVar207 * auVar84._4_4_;
        auVar174._8_4_ = auVar173._8_4_ + fVar208 * auVar84._8_4_;
        auVar174._12_4_ = auVar173._12_4_ + fVar209 * auVar84._12_4_;
        auVar84 = vsubps_avx(auVar174,auVar131);
        fVar187 = auVar131._0_4_ + fVar187 * auVar84._0_4_;
        fVar207 = auVar131._4_4_ + fVar207 * auVar84._4_4_;
        auVar99._0_8_ = CONCAT44(fVar207,fVar187);
        auVar99._8_4_ = auVar131._8_4_ + fVar208 * auVar84._8_4_;
        auVar99._12_4_ = auVar131._12_4_ + fVar209 * auVar84._12_4_;
        fVar208 = auVar84._0_4_ * 3.0;
        fVar209 = auVar84._4_4_ * 3.0;
        auVar132._0_8_ = CONCAT44(fVar209,fVar208);
        auVar132._8_4_ = auVar84._8_4_ * 3.0;
        auVar132._12_4_ = auVar84._12_4_ * 3.0;
        auVar175._8_8_ = auVar99._0_8_;
        auVar175._0_8_ = auVar99._0_8_;
        auVar84 = vshufpd_avx(auVar99,auVar99,3);
        auVar194 = vshufps_avx(auVar205,auVar205,0x55);
        auVar169 = vsubps_avx(auVar84,auVar175);
        auVar329._0_4_ = auVar169._0_4_ * auVar194._0_4_ + fVar187;
        auVar329._4_4_ = auVar169._4_4_ * auVar194._4_4_ + fVar207;
        auVar329._8_4_ = auVar169._8_4_ * auVar194._8_4_ + fVar187;
        auVar329._12_4_ = auVar169._12_4_ * auVar194._12_4_ + fVar207;
        auVar176._8_8_ = auVar132._0_8_;
        auVar176._0_8_ = auVar132._0_8_;
        auVar84 = vshufpd_avx(auVar132,auVar132,1);
        auVar84 = vsubps_avx(auVar84,auVar176);
        auVar133._0_4_ = auVar84._0_4_ * auVar194._0_4_ + fVar208;
        auVar133._4_4_ = auVar84._4_4_ * auVar194._4_4_ + fVar209;
        auVar133._8_4_ = auVar84._8_4_ * auVar194._8_4_ + fVar208;
        auVar133._12_4_ = auVar84._12_4_ * auVar194._12_4_ + fVar209;
        auVar194 = vmovshdup_avx(auVar133);
        auVar247._0_8_ = auVar194._0_8_ ^ 0x8000000080000000;
        auVar247._8_4_ = auVar194._8_4_ ^ 0x80000000;
        auVar247._12_4_ = auVar194._12_4_ ^ 0x80000000;
        auVar179 = vmovshdup_avx(auVar169);
        auVar84 = vunpcklps_avx(auVar179,auVar247);
        auVar139 = vshufps_avx(auVar84,auVar247,4);
        auVar100._0_8_ = auVar169._0_8_ ^ 0x8000000080000000;
        auVar100._8_4_ = -auVar169._8_4_;
        auVar100._12_4_ = -auVar169._12_4_;
        auVar84 = vmovlhps_avx(auVar100,auVar133);
        auVar128 = vshufps_avx(auVar84,auVar133,8);
        auVar84 = ZEXT416((uint)(auVar133._0_4_ * auVar179._0_4_ - auVar169._0_4_ * auVar194._0_4_))
        ;
        auVar194 = vshufps_avx(auVar84,auVar84,0);
        auVar84 = vdivps_avx(auVar139,auVar194);
        auVar194 = vdivps_avx(auVar128,auVar194);
        auVar128 = vinsertps_avx(auVar287,auVar341,0x1c);
        auVar169 = vinsertps_avx(auVar295,auVar352,0x1c);
        auVar129 = vinsertps_avx(auVar341,auVar287,0x4c);
        auVar83 = vinsertps_avx(auVar352,auVar295,0x4c);
        auVar179 = vmovsldup_avx(auVar84);
        auVar296._0_4_ = auVar128._0_4_ * auVar179._0_4_;
        auVar296._4_4_ = auVar128._4_4_ * auVar179._4_4_;
        auVar296._8_4_ = auVar128._8_4_ * auVar179._8_4_;
        auVar296._12_4_ = auVar128._12_4_ * auVar179._12_4_;
        auVar134._0_4_ = auVar179._0_4_ * auVar169._0_4_;
        auVar134._4_4_ = auVar179._4_4_ * auVar169._4_4_;
        auVar134._8_4_ = auVar179._8_4_ * auVar169._8_4_;
        auVar134._12_4_ = auVar179._12_4_ * auVar169._12_4_;
        auVar139 = vminps_avx(auVar296,auVar134);
        auVar179 = vmaxps_avx(auVar134,auVar296);
        auVar272 = vmovsldup_avx(auVar194);
        auVar353._0_4_ = auVar272._0_4_ * auVar129._0_4_;
        auVar353._4_4_ = auVar272._4_4_ * auVar129._4_4_;
        auVar353._8_4_ = auVar272._8_4_ * auVar129._8_4_;
        auVar353._12_4_ = auVar272._12_4_ * auVar129._12_4_;
        auVar297._0_4_ = auVar272._0_4_ * auVar83._0_4_;
        auVar297._4_4_ = auVar272._4_4_ * auVar83._4_4_;
        auVar297._8_4_ = auVar272._8_4_ * auVar83._8_4_;
        auVar297._12_4_ = auVar272._12_4_ * auVar83._12_4_;
        auVar272 = vminps_avx(auVar353,auVar297);
        auVar225._0_4_ = auVar139._0_4_ + auVar272._0_4_;
        auVar225._4_4_ = auVar139._4_4_ + auVar272._4_4_;
        auVar225._8_4_ = auVar139._8_4_ + auVar272._8_4_;
        auVar225._12_4_ = auVar139._12_4_ + auVar272._12_4_;
        auVar139 = vmaxps_avx(auVar297,auVar353);
        auVar272 = vsubps_avx(auVar308,auVar205);
        auVar74 = vsubps_avx(auVar317,auVar205);
        auVar135._0_4_ = auVar139._0_4_ + auVar179._0_4_;
        auVar135._4_4_ = auVar139._4_4_ + auVar179._4_4_;
        auVar135._8_4_ = auVar139._8_4_ + auVar179._8_4_;
        auVar135._12_4_ = auVar139._12_4_ + auVar179._12_4_;
        auVar318._8_8_ = 0x3f800000;
        auVar318._0_8_ = 0x3f800000;
        auVar179 = vsubps_avx(auVar318,auVar135);
        auVar139 = vsubps_avx(auVar318,auVar225);
        fVar235 = auVar272._0_4_;
        auVar319._0_4_ = fVar235 * auVar179._0_4_;
        fVar236 = auVar272._4_4_;
        auVar319._4_4_ = fVar236 * auVar179._4_4_;
        fVar313 = auVar272._8_4_;
        auVar319._8_4_ = fVar313 * auVar179._8_4_;
        fVar325 = auVar272._12_4_;
        auVar319._12_4_ = fVar325 * auVar179._12_4_;
        fVar208 = auVar74._0_4_;
        auVar136._0_4_ = fVar208 * auVar179._0_4_;
        fVar209 = auVar74._4_4_;
        auVar136._4_4_ = fVar209 * auVar179._4_4_;
        fVar210 = auVar74._8_4_;
        auVar136._8_4_ = fVar210 * auVar179._8_4_;
        fVar234 = auVar74._12_4_;
        auVar136._12_4_ = fVar234 * auVar179._12_4_;
        auVar342._0_4_ = fVar235 * auVar139._0_4_;
        auVar342._4_4_ = fVar236 * auVar139._4_4_;
        auVar342._8_4_ = fVar313 * auVar139._8_4_;
        auVar342._12_4_ = fVar325 * auVar139._12_4_;
        auVar226._0_4_ = fVar208 * auVar139._0_4_;
        auVar226._4_4_ = fVar209 * auVar139._4_4_;
        auVar226._8_4_ = fVar210 * auVar139._8_4_;
        auVar226._12_4_ = fVar234 * auVar139._12_4_;
        auVar179 = vminps_avx(auVar319,auVar342);
        auVar139 = vminps_avx(auVar136,auVar226);
        auVar272 = vminps_avx(auVar179,auVar139);
        auVar179 = vmaxps_avx(auVar342,auVar319);
        auVar139 = vmaxps_avx(auVar226,auVar136);
        auVar74 = vshufps_avx(auVar205,auVar205,0x54);
        auVar139 = vmaxps_avx(auVar139,auVar179);
        auVar75 = vshufps_avx(auVar329,auVar329,0);
        auVar114 = vshufps_avx(auVar329,auVar329,0x55);
        auVar179 = vhaddps_avx(auVar272,auVar272);
        auVar139 = vhaddps_avx(auVar139,auVar139);
        auVar227._0_4_ = auVar114._0_4_ * auVar194._0_4_ + auVar75._0_4_ * auVar84._0_4_;
        auVar227._4_4_ = auVar114._4_4_ * auVar194._4_4_ + auVar75._4_4_ * auVar84._4_4_;
        auVar227._8_4_ = auVar114._8_4_ * auVar194._8_4_ + auVar75._8_4_ * auVar84._8_4_;
        auVar227._12_4_ = auVar114._12_4_ * auVar194._12_4_ + auVar75._12_4_ * auVar84._12_4_;
        auVar272 = vsubps_avx(auVar74,auVar227);
        fVar187 = auVar272._0_4_ + auVar179._0_4_;
        fVar207 = auVar272._0_4_ + auVar139._0_4_;
        auVar179 = vmaxss_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar187));
        auVar139 = vminss_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar184));
      } while (auVar139._0_4_ < auVar179._0_4_);
      auVar179 = vmovshdup_avx(auVar84);
      auVar228._0_4_ = auVar128._0_4_ * auVar179._0_4_;
      auVar228._4_4_ = auVar128._4_4_ * auVar179._4_4_;
      auVar228._8_4_ = auVar128._8_4_ * auVar179._8_4_;
      auVar228._12_4_ = auVar128._12_4_ * auVar179._12_4_;
      auVar137._0_4_ = auVar179._0_4_ * auVar169._0_4_;
      auVar137._4_4_ = auVar179._4_4_ * auVar169._4_4_;
      auVar137._8_4_ = auVar179._8_4_ * auVar169._8_4_;
      auVar137._12_4_ = auVar179._12_4_ * auVar169._12_4_;
      auVar139 = vminps_avx(auVar228,auVar137);
      auVar179 = vmaxps_avx(auVar137,auVar228);
      auVar128 = vmovshdup_avx(auVar194);
      auVar101._0_4_ = auVar128._0_4_ * auVar129._0_4_;
      auVar101._4_4_ = auVar128._4_4_ * auVar129._4_4_;
      auVar101._8_4_ = auVar128._8_4_ * auVar129._8_4_;
      auVar101._12_4_ = auVar128._12_4_ * auVar129._12_4_;
      auVar229._0_4_ = auVar83._0_4_ * auVar128._0_4_;
      auVar229._4_4_ = auVar83._4_4_ * auVar128._4_4_;
      auVar229._8_4_ = auVar83._8_4_ * auVar128._8_4_;
      auVar229._12_4_ = auVar83._12_4_ * auVar128._12_4_;
      auVar128 = vminps_avx(auVar101,auVar229);
      auVar177._0_4_ = auVar139._0_4_ + auVar128._0_4_;
      auVar177._4_4_ = auVar139._4_4_ + auVar128._4_4_;
      auVar177._8_4_ = auVar139._8_4_ + auVar128._8_4_;
      auVar177._12_4_ = auVar139._12_4_ + auVar128._12_4_;
      auVar139 = vmaxps_avx(auVar229,auVar101);
      auVar102._0_4_ = auVar179._0_4_ + auVar139._0_4_;
      auVar102._4_4_ = auVar179._4_4_ + auVar139._4_4_;
      auVar102._8_4_ = auVar179._8_4_ + auVar139._8_4_;
      auVar102._12_4_ = auVar179._12_4_ + auVar139._12_4_;
      auVar179 = vsubps_avx(auVar263,auVar102);
      auVar139 = vsubps_avx(auVar263,auVar177);
      auVar178._0_4_ = fVar235 * auVar179._0_4_;
      auVar178._4_4_ = fVar236 * auVar179._4_4_;
      auVar178._8_4_ = fVar313 * auVar179._8_4_;
      auVar178._12_4_ = fVar325 * auVar179._12_4_;
      auVar230._0_4_ = fVar235 * auVar139._0_4_;
      auVar230._4_4_ = fVar236 * auVar139._4_4_;
      auVar230._8_4_ = fVar313 * auVar139._8_4_;
      auVar230._12_4_ = fVar325 * auVar139._12_4_;
      auVar103._0_4_ = fVar208 * auVar179._0_4_;
      auVar103._4_4_ = fVar209 * auVar179._4_4_;
      auVar103._8_4_ = fVar210 * auVar179._8_4_;
      auVar103._12_4_ = fVar234 * auVar179._12_4_;
      auVar138._0_4_ = fVar208 * auVar139._0_4_;
      auVar138._4_4_ = fVar209 * auVar139._4_4_;
      auVar138._8_4_ = fVar210 * auVar139._8_4_;
      auVar138._12_4_ = fVar234 * auVar139._12_4_;
      auVar179 = vminps_avx(auVar178,auVar230);
      auVar139 = vminps_avx(auVar103,auVar138);
      auVar179 = vminps_avx(auVar179,auVar139);
      auVar139 = vmaxps_avx(auVar230,auVar178);
      auVar128 = vmaxps_avx(auVar138,auVar103);
      auVar179 = vhaddps_avx(auVar179,auVar179);
      auVar139 = vmaxps_avx(auVar128,auVar139);
      auVar139 = vhaddps_avx(auVar139,auVar139);
      auVar128 = vmovshdup_avx(auVar272);
      auVar169 = ZEXT416((uint)(auVar128._0_4_ + auVar179._0_4_));
      auVar179 = vmaxss_avx(auVar92,auVar169);
      auVar128 = ZEXT416((uint)(auVar128._0_4_ + auVar139._0_4_));
      auVar139 = vminss_avx(auVar128,auVar73);
      auVar354._8_4_ = 0x7fffffff;
      auVar354._0_8_ = 0x7fffffff7fffffff;
      auVar354._12_4_ = 0x7fffffff;
    } while (auVar139._0_4_ < auVar179._0_4_);
    uVar70 = 0;
    if ((fVar186 < fVar187) && (fVar207 < fVar184)) {
      auVar179 = vcmpps_avx(auVar128,auVar73,1);
      auVar139 = vcmpps_avx(auVar92,auVar169,1);
      auVar179 = vandps_avx(auVar139,auVar179);
      uVar70 = auVar179._0_4_;
    }
    if ((3 < uVar71 || fVar185 < 0.001) || (uVar70 & 1) != 0) {
      lVar68 = 200;
      do {
        fVar185 = auVar272._0_4_;
        fVar184 = 1.0 - fVar185;
        auVar179 = ZEXT416((uint)(fVar184 * fVar184 * fVar184));
        auVar179 = vshufps_avx(auVar179,auVar179,0);
        auVar139 = ZEXT416((uint)(fVar185 * 3.0 * fVar184 * fVar184));
        auVar139 = vshufps_avx(auVar139,auVar139,0);
        auVar128 = ZEXT416((uint)(fVar184 * fVar185 * fVar185 * 3.0));
        auVar128 = vshufps_avx(auVar128,auVar128,0);
        auVar169 = ZEXT416((uint)(fVar185 * fVar185 * fVar185));
        auVar169 = vshufps_avx(auVar169,auVar169,0);
        fVar184 = local_610 * auVar179._0_4_ +
                  (float)local_620._0_4_ * auVar139._0_4_ +
                  (float)local_4a0._0_4_ * auVar169._0_4_ + local_630 * auVar128._0_4_;
        fVar185 = fStack_60c * auVar179._4_4_ +
                  (float)local_620._4_4_ * auVar139._4_4_ +
                  (float)local_4a0._4_4_ * auVar169._4_4_ + fStack_62c * auVar128._4_4_;
        auVar104._0_8_ = CONCAT44(fVar185,fVar184);
        auVar104._8_4_ =
             fStack_608 * auVar179._8_4_ +
             fStack_618 * auVar139._8_4_ + fStack_498 * auVar169._8_4_ + fStack_628 * auVar128._8_4_
        ;
        auVar104._12_4_ =
             fStack_604 * auVar179._12_4_ +
             fStack_614 * auVar139._12_4_ +
             fStack_494 * auVar169._12_4_ + fStack_624 * auVar128._12_4_;
        auVar140._8_8_ = auVar104._0_8_;
        auVar140._0_8_ = auVar104._0_8_;
        auVar139 = vshufpd_avx(auVar104,auVar104,1);
        auVar179 = vmovshdup_avx(auVar272);
        auVar139 = vsubps_avx(auVar139,auVar140);
        auVar105._0_4_ = auVar179._0_4_ * auVar139._0_4_ + fVar184;
        auVar105._4_4_ = auVar179._4_4_ * auVar139._4_4_ + fVar185;
        auVar105._8_4_ = auVar179._8_4_ * auVar139._8_4_ + fVar184;
        auVar105._12_4_ = auVar179._12_4_ * auVar139._12_4_ + fVar185;
        auVar179 = vshufps_avx(auVar105,auVar105,0);
        auVar139 = vshufps_avx(auVar105,auVar105,0x55);
        auVar141._0_4_ = auVar84._0_4_ * auVar179._0_4_ + auVar194._0_4_ * auVar139._0_4_;
        auVar141._4_4_ = auVar84._4_4_ * auVar179._4_4_ + auVar194._4_4_ * auVar139._4_4_;
        auVar141._8_4_ = auVar84._8_4_ * auVar179._8_4_ + auVar194._8_4_ * auVar139._8_4_;
        auVar141._12_4_ = auVar84._12_4_ * auVar179._12_4_ + auVar194._12_4_ * auVar139._12_4_;
        auVar272 = vsubps_avx(auVar272,auVar141);
        auVar179 = vandps_avx(auVar354,auVar105);
        auVar139 = vshufps_avx(auVar179,auVar179,0xf5);
        auVar179 = vmaxss_avx(auVar139,auVar179);
        if (auVar179._0_4_ < (float)local_4b0._0_4_) {
          fVar184 = auVar272._0_4_;
          if ((0.0 <= fVar184) && (fVar184 <= 1.0)) {
            auVar84 = vmovshdup_avx(auVar272);
            fVar185 = auVar84._0_4_;
            if ((0.0 <= fVar185) && (fVar185 <= 1.0)) {
              auVar84 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar83 = vinsertps_avx(auVar84,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar84 = vdpps_avx(auVar83,local_380,0x7f);
              auVar194 = vdpps_avx(auVar83,local_390,0x7f);
              auVar179 = vdpps_avx(auVar83,local_3c0,0x7f);
              auVar139 = vdpps_avx(auVar83,local_3d0,0x7f);
              auVar128 = vdpps_avx(auVar83,local_3e0,0x7f);
              auVar169 = vdpps_avx(auVar83,local_3f0,0x7f);
              fVar209 = 1.0 - fVar185;
              auVar129 = vdpps_avx(auVar83,local_3a0,0x7f);
              auVar83 = vdpps_avx(auVar83,local_3b0,0x7f);
              fVar210 = 1.0 - fVar184;
              fVar186 = auVar272._4_4_;
              fVar187 = auVar272._8_4_;
              fVar207 = auVar272._12_4_;
              fVar208 = fVar210 * fVar184 * fVar184 * 3.0;
              auVar248._0_4_ = fVar184 * fVar184 * fVar184;
              auVar248._4_4_ = fVar186 * fVar186 * fVar186;
              auVar248._8_4_ = fVar187 * fVar187 * fVar187;
              auVar248._12_4_ = fVar207 * fVar207 * fVar207;
              fVar186 = fVar184 * 3.0 * fVar210 * fVar210;
              fVar187 = fVar210 * fVar210 * fVar210;
              fVar184 = (fVar209 * auVar84._0_4_ + fVar185 * auVar179._0_4_) * fVar187 +
                        (fVar209 * auVar194._0_4_ + fVar185 * auVar139._0_4_) * fVar186 +
                        fVar208 * (fVar209 * auVar129._0_4_ + fVar185 * auVar128._0_4_) +
                        auVar248._0_4_ * (auVar169._0_4_ * fVar185 + fVar209 * auVar83._0_4_);
              if ((fVar149 <= fVar184) &&
                 (fVar185 = *(float *)(ray + k * 4 + 0x100), fVar184 <= fVar185)) {
                pGVar8 = (context->scene->geometries).items[uVar66].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_00f8f171:
                  bVar65 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar65 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_f0 = vshufps_avx(auVar272,auVar272,0x55);
                  auVar288._8_4_ = 0x3f800000;
                  auVar288._0_8_ = 0x3f8000003f800000;
                  auVar288._12_4_ = 0x3f800000;
                  auVar84 = vsubps_avx(auVar288,local_f0);
                  fVar207 = local_f0._0_4_;
                  fVar209 = local_f0._4_4_;
                  fVar234 = local_f0._8_4_;
                  fVar235 = local_f0._12_4_;
                  fVar236 = auVar84._0_4_;
                  fVar313 = auVar84._4_4_;
                  fVar325 = auVar84._8_4_;
                  fVar330 = auVar84._12_4_;
                  auVar298._0_4_ =
                       fVar207 * (float)local_4f0._0_4_ + fVar236 * (float)local_4c0._0_4_;
                  auVar298._4_4_ =
                       fVar209 * (float)local_4f0._4_4_ + fVar313 * (float)local_4c0._4_4_;
                  auVar298._8_4_ = fVar234 * fStack_4e8 + fVar325 * fStack_4b8;
                  auVar298._12_4_ = fVar235 * fStack_4e4 + fVar330 * fStack_4b4;
                  auVar309._0_4_ = fVar207 * fVar251 + fVar236 * fVar237;
                  auVar309._4_4_ = fVar209 * fVar150 + fVar313 * fVar253;
                  auVar309._8_4_ = fVar234 * fVar323 + fVar325 * fVar322;
                  auVar309._12_4_ = fVar235 * fVar311 + fVar330 * fVar304;
                  auVar320._0_4_ = fVar207 * fVar252 + fVar236 * (float)local_4d0._0_4_;
                  auVar320._4_4_ = fVar209 * fVar314 + fVar313 * (float)local_4d0._4_4_;
                  auVar320._8_4_ = fVar234 * fVar324 + fVar325 * fStack_4c8;
                  auVar320._12_4_ = fVar235 * fVar312 + fVar330 * fStack_4c4;
                  auVar289._0_4_ = fVar207 * local_500 + fVar236 * (float)local_4e0._0_4_;
                  auVar289._4_4_ = fVar209 * fStack_4fc + fVar313 * (float)local_4e0._4_4_;
                  auVar289._8_4_ = fVar234 * fStack_4f8 + fVar325 * fStack_4d8;
                  auVar289._12_4_ = fVar235 * fStack_4f4 + fVar330 * fStack_4d4;
                  auVar139 = vsubps_avx(auVar309,auVar298);
                  auVar128 = vsubps_avx(auVar320,auVar309);
                  auVar169 = vsubps_avx(auVar289,auVar320);
                  local_110 = vshufps_avx(auVar272,auVar272,0);
                  fVar207 = local_110._0_4_;
                  fVar234 = local_110._4_4_;
                  fVar235 = local_110._8_4_;
                  fVar313 = local_110._12_4_;
                  auVar84 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
                  fVar209 = auVar84._0_4_;
                  fVar210 = auVar84._4_4_;
                  fVar236 = auVar84._8_4_;
                  fVar325 = auVar84._12_4_;
                  auVar84 = vshufps_avx(auVar248,auVar248,0);
                  auVar194 = vshufps_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),0);
                  auVar179 = vshufps_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),0);
                  auVar231._0_4_ =
                       ((auVar128._0_4_ * fVar209 + auVar169._0_4_ * fVar207) * fVar207 +
                       (auVar139._0_4_ * fVar209 + auVar128._0_4_ * fVar207) * fVar209) * 3.0;
                  auVar231._4_4_ =
                       ((auVar128._4_4_ * fVar210 + auVar169._4_4_ * fVar234) * fVar234 +
                       (auVar139._4_4_ * fVar210 + auVar128._4_4_ * fVar234) * fVar210) * 3.0;
                  auVar231._8_4_ =
                       ((auVar128._8_4_ * fVar236 + auVar169._8_4_ * fVar235) * fVar235 +
                       (auVar139._8_4_ * fVar236 + auVar128._8_4_ * fVar235) * fVar236) * 3.0;
                  auVar231._12_4_ =
                       ((auVar128._12_4_ * fVar325 + auVar169._12_4_ * fVar313) * fVar313 +
                       (auVar139._12_4_ * fVar325 + auVar128._12_4_ * fVar313) * fVar325) * 3.0;
                  auVar139 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
                  auVar142._0_4_ =
                       auVar139._0_4_ * (float)local_420._0_4_ +
                       auVar179._0_4_ * (float)local_430._0_4_ +
                       auVar84._0_4_ * (float)local_450._0_4_ +
                       auVar194._0_4_ * (float)local_440._0_4_;
                  auVar142._4_4_ =
                       auVar139._4_4_ * (float)local_420._4_4_ +
                       auVar179._4_4_ * (float)local_430._4_4_ +
                       auVar84._4_4_ * (float)local_450._4_4_ +
                       auVar194._4_4_ * (float)local_440._4_4_;
                  auVar142._8_4_ =
                       auVar139._8_4_ * fStack_418 +
                       auVar179._8_4_ * fStack_428 +
                       auVar84._8_4_ * fStack_448 + auVar194._8_4_ * fStack_438;
                  auVar142._12_4_ =
                       auVar139._12_4_ * fStack_414 +
                       auVar179._12_4_ * fStack_424 +
                       auVar84._12_4_ * fStack_444 + auVar194._12_4_ * fStack_434;
                  auVar84 = vshufps_avx(auVar231,auVar231,0xc9);
                  auVar180._0_4_ = auVar142._0_4_ * auVar84._0_4_;
                  auVar180._4_4_ = auVar142._4_4_ * auVar84._4_4_;
                  auVar180._8_4_ = auVar142._8_4_ * auVar84._8_4_;
                  auVar180._12_4_ = auVar142._12_4_ * auVar84._12_4_;
                  auVar84 = vshufps_avx(auVar142,auVar142,0xc9);
                  auVar143._0_4_ = auVar231._0_4_ * auVar84._0_4_;
                  auVar143._4_4_ = auVar231._4_4_ * auVar84._4_4_;
                  auVar143._8_4_ = auVar231._8_4_ * auVar84._8_4_;
                  auVar143._12_4_ = auVar231._12_4_ * auVar84._12_4_;
                  auVar84 = vsubps_avx(auVar143,auVar180);
                  local_170 = vshufps_avx(auVar84,auVar84,0x55);
                  local_180[0] = (RTCHitN)local_170[0];
                  local_180[1] = (RTCHitN)local_170[1];
                  local_180[2] = (RTCHitN)local_170[2];
                  local_180[3] = (RTCHitN)local_170[3];
                  local_180[4] = (RTCHitN)local_170[4];
                  local_180[5] = (RTCHitN)local_170[5];
                  local_180[6] = (RTCHitN)local_170[6];
                  local_180[7] = (RTCHitN)local_170[7];
                  local_180[8] = (RTCHitN)local_170[8];
                  local_180[9] = (RTCHitN)local_170[9];
                  local_180[10] = (RTCHitN)local_170[10];
                  local_180[0xb] = (RTCHitN)local_170[0xb];
                  local_180[0xc] = (RTCHitN)local_170[0xc];
                  local_180[0xd] = (RTCHitN)local_170[0xd];
                  local_180[0xe] = (RTCHitN)local_170[0xe];
                  local_180[0xf] = (RTCHitN)local_170[0xf];
                  local_150 = vshufps_avx(auVar84,auVar84,0xaa);
                  local_160 = local_150;
                  local_130 = vshufps_avx(auVar84,auVar84,0);
                  local_140 = local_130;
                  local_120 = local_110;
                  local_100 = local_f0;
                  local_e0 = local_300._0_8_;
                  uStack_d8 = local_300._8_8_;
                  uStack_d0 = local_300._16_8_;
                  uStack_c8 = local_300._24_8_;
                  local_c0 = local_2e0._0_8_;
                  uStack_b8 = local_2e0._8_8_;
                  uStack_b0 = local_2e0._16_8_;
                  uStack_a8 = local_2e0._24_8_;
                  auVar107 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar184;
                  local_520 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar63 & 0xf) << 4));
                  local_510 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)((int)uVar63 >> 4) * 0x10);
                  local_480.valid = (int *)local_520;
                  local_480.geometryUserPtr = pGVar8->userPtr;
                  local_480.context = context->user;
                  local_480.ray = (RTCRayN *)ray;
                  local_480.hit = local_180;
                  local_480.N = 8;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_480);
                  }
                  auVar84 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                  auVar194 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                  auVar183._16_16_ = auVar194;
                  auVar183._0_16_ = auVar84;
                  auVar18 = auVar107 & ~auVar183;
                  if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar18 >> 0x7f,0) != '\0') ||
                        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar18 >> 0xbf,0) != '\0') ||
                      (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar18[0x1f] < '\0') {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_480);
                    }
                    auVar84 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                    auVar194 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                    auVar113._16_16_ = auVar194;
                    auVar113._0_16_ = auVar84;
                    auVar148._8_4_ = 0xff800000;
                    auVar148._0_8_ = 0xff800000ff800000;
                    auVar148._12_4_ = 0xff800000;
                    auVar148._16_4_ = 0xff800000;
                    auVar148._20_4_ = 0xff800000;
                    auVar148._24_4_ = 0xff800000;
                    auVar148._28_4_ = 0xff800000;
                    auVar18 = vblendvps_avx(auVar148,*(undefined1 (*) [32])(local_480.ray + 0x100),
                                            auVar113);
                    *(undefined1 (*) [32])(local_480.ray + 0x100) = auVar18;
                    auVar107 = auVar107 & ~auVar113;
                    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar107 >> 0x7f,0) != '\0') ||
                          (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar107 >> 0xbf,0) != '\0') ||
                        (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar107[0x1f] < '\0') {
                      bVar65 = 1;
                      goto LAB_00f8f173;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar185;
                  goto LAB_00f8f171;
                }
LAB_00f8f173:
                bVar72 = (bool)(bVar72 | bVar65);
              }
            }
          }
          break;
        }
        lVar68 = lVar68 + -1;
      } while (lVar68 != 0);
      goto LAB_00f8e181;
    }
    local_400 = vinsertps_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar184),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }